

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLLinOp::defineGrids
          (MLLinOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory)

{
  Vector<int,_std::allocator<int>_> *pVVar1;
  pointer *ppIVar2;
  int *piVar3;
  iterator iVar4;
  pointer ppFVar5;
  pointer pGVar6;
  vector<amrex::Geometry,std::allocator<amrex::Geometry>> *pvVar7;
  iterator iVar8;
  BATransformer *this_00;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *pvVar9;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *pvVar10;
  pointer pDVar11;
  pointer pDVar12;
  long *plVar13;
  pointer pVVar14;
  iterator iVar15;
  pointer pVVar16;
  char cVar17;
  undefined8 uVar18;
  _Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  _Var19;
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  *pVVar20;
  undefined8 uVar21;
  bool bVar22;
  bool bVar23;
  int i;
  uint uVar24;
  int iVar25;
  int iVar26;
  undefined4 uVar27;
  long lVar28;
  Geometry *pGVar29;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Long LVar30;
  Long LVar31;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar32;
  ostream *poVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  byte bVar38;
  uint uVar39;
  Vector<int,_std::allocator<int>_> *pVVar40;
  ulong uVar41;
  int iVar42;
  int iVar43;
  int dir;
  long lVar44;
  int dir_1;
  int idim;
  vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
  *pvVar45;
  long lVar46;
  ulong uVar47;
  int idim_1;
  double dVar48;
  initializer_list<amrex::Box> __l;
  initializer_list<amrex::Box> __l_00;
  initializer_list<int> __l_01;
  initializer_list<amrex::IntVect> __l_02;
  IntVect rr;
  IntVect rr_vec;
  IntVect rr_level_1;
  IntVect mg_coarsen_ratio_v;
  IntVect rr_level;
  IntVect is_coarsenable_1;
  int coord;
  IntVect is_coarsenable;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> accum_coarsen_ratio;
  IntVect mg_box_min_width_v;
  Vector<int,_std::allocator<int>_> agg_flag;
  IntVect mg_domain_min_width_v;
  Box result;
  Box local_358;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> local_338;
  IndexType IStack_330;
  uint auStack_32c [3];
  IndexType IStack_320;
  IntVect local_318;
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  *local_308;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *local_300;
  undefined8 local_2f4;
  uint local_2ec;
  ulong local_2e8;
  double local_2e0;
  Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  *local_2d8;
  Vector<int,_std::allocator<int>_> *local_2d0;
  undefined8 local_2c8;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *local_2c0;
  vector<amrex::Box,_std::allocator<amrex::Box>_> local_2b8;
  IntVect local_2a0;
  CoordType local_294;
  vector<amrex::Box,_std::allocator<amrex::Box>_> local_290;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *local_278;
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  *local_270;
  pointer local_268;
  double local_260;
  Box local_258;
  Vector<int,_std::allocator<int>_> *local_230;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_228;
  uint local_210;
  int local_20c;
  int local_208;
  IntVect local_204;
  vector<int,_std::allocator<int>_> local_1f8;
  array<int,_3UL> local_1e0;
  IntVect local_1d4;
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  *local_1c8;
  Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  *local_1c0;
  undefined1 local_1b8 [12];
  int iStack_1ac;
  ostringstream aoStack_1a8 [8];
  undefined8 auStack_1a0 [46];
  
  iVar34 = (int)((long)(a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3) * -0x3d70a3d7;
  this->m_num_amr_levels = iVar34;
  pVVar1 = &this->m_amr_ref_ratio;
  local_2c0 = a_grids;
  local_278 = a_dmap;
  local_1c0 = a_factory;
  std::vector<int,_std::allocator<int>_>::resize
            (&pVVar1->super_vector<int,_std::allocator<int>_>,(long)iVar34);
  local_2d0 = &this->m_num_mg_levels;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_2d0->super_vector<int,_std::allocator<int>_>,(long)this->m_num_amr_levels);
  local_270 = &this->m_geom;
  std::
  vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::resize(&local_270->
            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ,(long)this->m_num_amr_levels);
  local_308 = &this->m_grids;
  std::
  vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ::resize(&local_308->
            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           ,(long)this->m_num_amr_levels);
  local_2d8 = &this->m_dmap;
  std::
  vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ::resize(&local_2d8->
            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           ,(long)this->m_num_amr_levels);
  local_1c8 = &this->m_factory;
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::resize(&local_1c8->
            super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
           ,(long)this->m_num_amr_levels);
  this->m_default_comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
  local_268 = (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_294 = (local_268->super_CoordSys).c_sys;
  local_1e0._M_elems._0_8_ =
       (ulong)(byte)(local_268->super_CoordSys).field_0x52 << 0x20 |
       (ulong)(byte)(local_268->super_CoordSys).field_0x51;
  local_1e0._M_elems[2] = (int)(byte)(local_268->super_CoordSys).field_0x53;
  local_2f4 = (pointer)0x200000002;
  local_2ec = 2;
  local_204.vect[0] = 2;
  local_204.vect[1] = 2;
  local_204.vect[2] = 2;
  local_1d4.vect[0] = 4;
  local_1d4.vect[1] = 4;
  local_1d4.vect[2] = 4;
  local_300 = a_geom;
  if ((uint)(this->info).hidden_direction < 3) {
    if (this->m_num_amr_levels != 1) {
      Assert_host("AMREX_SPACEDIM == 3 && m_num_amr_levels == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLLinOp.cpp"
                  ,0xcc,"\"Hidden direction only supported for 3d level solve\"");
    }
    lVar28 = (long)(this->info).hidden_direction;
    *(undefined4 *)((long)&local_2f4 + lVar28 * 4) = 1;
    local_204.vect[lVar28] = 0;
    local_1d4.vect[lVar28] = 0;
  }
  local_268 = (pointer)&local_268->prob_domain;
  local_230 = pVVar1;
  if (1 < (long)this->m_num_amr_levels) {
    local_208 = (int)local_2f4;
    local_20c = local_2f4._4_4_;
    local_210 = local_2ec;
    uVar47 = (long)this->m_num_amr_levels;
    do {
      uVar41 = uVar47 - 1;
      (local_2d0->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar47 - 1] = 1;
      pvVar7 = (vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
               ((local_270->
                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ).
                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar41);
      pGVar29 = (local_300->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                super__Vector_impl_data._M_start + uVar41;
      iVar4._M_current = *(Geometry **)(pvVar7 + 8);
      if (iVar4._M_current == *(Geometry **)(pvVar7 + 0x10)) {
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        _M_realloc_insert<amrex::Geometry_const&>(pvVar7,iVar4,pGVar29);
      }
      else {
        memcpy(iVar4._M_current,pGVar29,200);
        *(long *)(pvVar7 + 8) = *(long *)(pvVar7 + 8) + 200;
      }
      local_2e0 = (double)(uVar41 * 0x68);
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::push_back
                (&(local_308->
                  super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  ).
                  super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar41].
                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                 (local_2c0->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar41);
      local_2c8 = (double)(uVar41 * 0x10);
      std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
      push_back(&(local_2d8->
                 super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar41].
                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ,(local_278->
                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ).
                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar41);
      ppFVar5 = (local_1c0->
                super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                ).
                super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar45 = (vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
                 *)((local_1c8->
                    super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    ).
                    super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar41);
      local_2e8 = uVar41;
      local_260 = (double)(uVar41 * 0x18);
      if ((long)(local_1c0->
                super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                ).
                super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3 < (long)uVar47) {
        local_1b8._0_8_ = operator_new(8);
        *(undefined ***)local_1b8._0_8_ = &PTR__FabFactory_0074e8d0;
        std::
        vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
        ::
        emplace_back<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>
                  (pvVar45,(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            *)local_1b8);
        if ((_Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             )local_1b8._0_8_ != (FabFactory<amrex::FArrayBox> *)0x0) {
          (**(code **)(*(long *)local_1b8._0_8_ + 8))();
        }
      }
      else {
        local_1b8._0_4_ = (*ppFVar5[uVar41]->_vptr_FabFactory[5])();
        local_1b8._4_4_ = extraout_var;
        iVar8._M_current =
             *(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               **)(pvVar45 + 8);
        if (iVar8._M_current ==
            *(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              **)(pvVar45 + 0x10)) {
          std::
          vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
          ::_M_realloc_insert<amrex::FabFactory<amrex::FArrayBox>*>
                    (pvVar45,iVar8,(FabFactory<amrex::FArrayBox> **)local_1b8);
        }
        else {
          ((iVar8._M_current)->_M_t).
          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
               (FabFactory<amrex::FArrayBox> *)local_1b8._0_8_;
          *(long *)(pvVar45 + 8) = *(long *)(pvVar45 + 8) + 8;
        }
      }
      local_358.smallend.vect[2] = local_2ec;
      local_358.smallend.vect._0_8_ = local_2f4;
      pGVar6 = (local_300->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar34 = 0;
      do {
        local_1b8._0_8_ =
             (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              )0x100000001;
        local_1b8._8_4_ = 1;
        bVar22 = Box::coarsenable(&pGVar6[uVar41].domain,&local_358.smallend,(IntVect *)local_1b8);
        if (!bVar22) {
          Abort_host("MLLinOp: Uncoarsenable domain");
        }
        _Var19.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
             *(_Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> *)
              pGVar6[uVar41].domain.smallend.vect;
        lVar28 = *(long *)(pGVar6[uVar41].domain.smallend.vect + 2);
        lVar46 = *(long *)pGVar6[uVar41].domain.bigend.vect;
        uVar32 = *(undefined8 *)(pGVar6[uVar41].domain.bigend.vect + 2);
        aoStack_1a8._0_4_ = (undefined4)((ulong)lVar46 >> 0x20);
        aoStack_1a8._4_4_ = (undefined4)uVar32;
        auStack_1a0[0]._0_4_ = (undefined4)((ulong)uVar32 >> 0x20);
        local_1b8._8_4_ = (undefined4)lVar28;
        iStack_1ac = (int)((ulong)lVar28 >> 0x20);
        if (((local_358.smallend.vect[0] != 1) || (local_358.smallend.vect[1] != 1)) ||
           (local_1b8._0_8_ =
                 _Var19.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                 _M_head_impl, local_358.smallend.vect[2] != 1)) {
          local_1b8._0_4_ =
               _Var19.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
               _M_head_impl._0_4_;
          if (local_358.smallend.vect[0] != 1) {
            if (local_358.smallend.vect[0] == 4) {
              if ((int)local_1b8._0_4_ < 0) {
                uVar37 = local_1b8._0_4_ + indexType;
                uVar39 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar39 = uVar37;
                }
                uVar39 = uVar39 >> 2;
LAB_0056db50:
                local_1b8._0_4_ = ~uVar39;
              }
              else {
                local_1b8._0_4_ = (uint)local_1b8._0_4_ >> 2;
              }
            }
            else if (local_358.smallend.vect[0] == 2) {
              if ((int)local_1b8._0_4_ < 0) {
                uVar37 = local_1b8._0_4_ + indexType;
                uVar39 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar39 = uVar37;
                }
                uVar39 = uVar39 >> 1;
                goto LAB_0056db50;
              }
              local_1b8._0_4_ = (uint)local_1b8._0_4_ >> 1;
            }
            else if ((int)local_1b8._0_4_ < 0) {
              iVar25 = local_1b8._0_4_ + indexType;
              iVar42 = -iVar25;
              if (0 < iVar25) {
                iVar42 = iVar25;
              }
              local_1b8._0_4_ = ~(iVar42 / local_358.smallend.vect[0]);
            }
            else {
              local_1b8._0_4_ = (int)local_1b8._0_4_ / local_358.smallend.vect[0];
            }
          }
          local_1b8._4_4_ =
               _Var19.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
               _M_head_impl._4_4_;
          if (local_358.smallend.vect[1] != 1) {
            if (local_358.smallend.vect[1] == 4) {
              if ((long)_Var19.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl < 0) {
                uVar37 = local_1b8._4_4_ + 1;
                uVar39 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar39 = uVar37;
                }
                uVar39 = uVar39 >> 2;
LAB_0056dbb6:
                local_1b8._4_4_ = ~uVar39;
              }
              else {
                local_1b8._4_4_ = (uint)local_1b8._4_4_ >> 2;
              }
            }
            else if (local_358.smallend.vect[1] == 2) {
              if ((long)_Var19.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl < 0) {
                uVar37 = local_1b8._4_4_ + 1;
                uVar39 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar39 = uVar37;
                }
                uVar39 = uVar39 >> 1;
                goto LAB_0056dbb6;
              }
              local_1b8._4_4_ = (uint)local_1b8._4_4_ >> 1;
            }
            else if ((long)_Var19.
                           super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl < 0) {
              iVar25 = local_1b8._4_4_ + 1;
              iVar42 = -iVar25;
              if (0 < iVar25) {
                iVar42 = iVar25;
              }
              local_1b8._4_4_ = ~(iVar42 / local_358.smallend.vect[1]);
            }
            else {
              local_1b8._4_4_ = (int)local_1b8._4_4_ / local_358.smallend.vect[1];
            }
          }
          if (local_358.smallend.vect[2] != 1) {
            if (local_358.smallend.vect[2] == 4) {
              if ((int)local_1b8._8_4_ < 0) {
                uVar37 = local_1b8._8_4_ + 1;
                uVar39 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar39 = uVar37;
                }
                uVar39 = uVar39 >> 2;
LAB_0056dc25:
                local_1b8._8_4_ = ~uVar39;
              }
              else {
                local_1b8._8_4_ = (uint)local_1b8._8_4_ >> 2;
              }
            }
            else if (local_358.smallend.vect[2] == 2) {
              if ((int)local_1b8._8_4_ < 0) {
                uVar37 = local_1b8._8_4_ + 1;
                uVar39 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar39 = uVar37;
                }
                uVar39 = uVar39 >> 1;
                goto LAB_0056dc25;
              }
              local_1b8._8_4_ = (uint)local_1b8._8_4_ >> 1;
            }
            else if ((int)local_1b8._8_4_ < 0) {
              iVar25 = local_1b8._8_4_ + 1;
              iVar42 = -iVar25;
              if (0 < iVar25) {
                iVar42 = iVar25;
              }
              local_1b8._8_4_ = ~(iVar42 / local_358.smallend.vect[2]);
            }
            else {
              local_1b8._8_4_ = (int)local_1b8._8_4_ / local_358.smallend.vect[2];
            }
          }
          if ((undefined4)auStack_1a0[0] == 0) {
            if (local_358.smallend.vect[0] != 1) {
              if (local_358.smallend.vect[0] == 4) {
                if (lVar28 < 0) {
                  iStack_1ac = iStack_1ac + 1;
                  uVar39 = -iStack_1ac;
                  if (0 < iStack_1ac) {
                    uVar39 = iStack_1ac;
                  }
                  uVar39 = uVar39 >> 2;
LAB_0056df8d:
                  iStack_1ac = ~uVar39;
                }
                else {
                  iStack_1ac = (uint)iStack_1ac >> 2;
                }
              }
              else if (local_358.smallend.vect[0] == 2) {
                if (lVar28 < 0) {
                  iStack_1ac = iStack_1ac + 1;
                  uVar39 = -iStack_1ac;
                  if (0 < iStack_1ac) {
                    uVar39 = iStack_1ac;
                  }
                  uVar39 = uVar39 >> 1;
                  goto LAB_0056df8d;
                }
                iStack_1ac = (uint)iStack_1ac >> 1;
              }
              else if (lVar28 < 0) {
                iVar25 = iStack_1ac + 1;
                iVar42 = -iVar25;
                if (0 < iVar25) {
                  iVar42 = iVar25;
                }
                iStack_1ac = ~(iVar42 / local_358.smallend.vect[0]);
              }
              else {
                iStack_1ac = iStack_1ac / local_358.smallend.vect[0];
              }
            }
            if (local_358.smallend.vect[1] != 1) {
              if (local_358.smallend.vect[1] == 4) {
                if (lVar46 < 0) {
                  aoStack_1a8._0_4_ = aoStack_1a8._0_4_ + 1;
                  uVar39 = -aoStack_1a8._0_4_;
                  if (0 < (int)aoStack_1a8._0_4_) {
                    uVar39 = aoStack_1a8._0_4_;
                  }
                  uVar39 = uVar39 >> 2;
LAB_0056dff3:
                  aoStack_1a8._0_4_ = ~uVar39;
                }
                else {
                  aoStack_1a8._0_4_ = (uint)aoStack_1a8._0_4_ >> 2;
                }
              }
              else if (local_358.smallend.vect[1] == 2) {
                if (lVar46 < 0) {
                  aoStack_1a8._0_4_ = aoStack_1a8._0_4_ + 1;
                  uVar39 = -aoStack_1a8._0_4_;
                  if (0 < (int)aoStack_1a8._0_4_) {
                    uVar39 = aoStack_1a8._0_4_;
                  }
                  uVar39 = uVar39 >> 1;
                  goto LAB_0056dff3;
                }
                aoStack_1a8._0_4_ = (uint)aoStack_1a8._0_4_ >> 1;
              }
              else if (lVar46 < 0) {
                iVar25 = aoStack_1a8._0_4_ + 1;
                iVar42 = -iVar25;
                if (0 < iVar25) {
                  iVar42 = iVar25;
                }
                aoStack_1a8._0_4_ = ~(iVar42 / local_358.smallend.vect[1]);
              }
              else {
                aoStack_1a8._0_4_ = (int)aoStack_1a8._0_4_ / local_358.smallend.vect[1];
              }
            }
            if (local_358.smallend.vect[2] != 1) {
              if (local_358.smallend.vect[2] == 4) {
                if ((int)aoStack_1a8._4_4_ < 0) {
                  aoStack_1a8._4_4_ = aoStack_1a8._4_4_ + 1;
                  uVar39 = -aoStack_1a8._4_4_;
                  if (0 < (int)aoStack_1a8._4_4_) {
                    uVar39 = aoStack_1a8._4_4_;
                  }
                  uVar39 = uVar39 >> 2;
LAB_0056e06a:
                  aoStack_1a8._4_4_ = ~uVar39;
                }
                else {
                  aoStack_1a8._4_4_ = (uint)aoStack_1a8._4_4_ >> 2;
                }
              }
              else if (local_358.smallend.vect[2] == 2) {
                if ((int)aoStack_1a8._4_4_ < 0) {
                  aoStack_1a8._4_4_ = aoStack_1a8._4_4_ + 1;
                  uVar39 = -aoStack_1a8._4_4_;
                  if (0 < (int)aoStack_1a8._4_4_) {
                    uVar39 = aoStack_1a8._4_4_;
                  }
                  uVar39 = uVar39 >> 1;
                  goto LAB_0056e06a;
                }
                aoStack_1a8._4_4_ = (uint)aoStack_1a8._4_4_ >> 1;
              }
              else if ((int)aoStack_1a8._4_4_ < 0) {
                iVar25 = aoStack_1a8._4_4_ + 1;
                iVar42 = -iVar25;
                if (0 < iVar25) {
                  iVar42 = iVar25;
                }
                aoStack_1a8._4_4_ = ~(iVar42 / local_358.smallend.vect[2]);
              }
              else {
                aoStack_1a8._4_4_ = (int)aoStack_1a8._4_4_ / local_358.smallend.vect[2];
              }
            }
          }
          else {
            local_258.smallend.vect[0] = 0;
            local_258.smallend.vect[1] = 0;
            local_258.smallend.vect[2] = 0;
            lVar44 = 0;
            do {
              if ((((uint)(undefined4)auStack_1a0[0] >> ((uint)lVar44 & 0x1f) & 1) != 0) &&
                 ((&iStack_1ac)[lVar44] % local_358.smallend.vect[lVar44] != 0)) {
                local_258.smallend.vect[lVar44] = 1;
              }
              lVar44 = lVar44 + 1;
            } while (lVar44 != 3);
            if (local_358.smallend.vect[0] != 1) {
              if (local_358.smallend.vect[0] == 4) {
                if (lVar28 < 0) {
                  iStack_1ac = iStack_1ac + 1;
                  uVar39 = -iStack_1ac;
                  if (0 < iStack_1ac) {
                    uVar39 = iStack_1ac;
                  }
                  uVar39 = uVar39 >> 2;
LAB_0056dd30:
                  iStack_1ac = ~uVar39;
                }
                else {
                  iStack_1ac = (uint)iStack_1ac >> 2;
                }
              }
              else if (local_358.smallend.vect[0] == 2) {
                if (lVar28 < 0) {
                  iStack_1ac = iStack_1ac + 1;
                  uVar39 = -iStack_1ac;
                  if (0 < iStack_1ac) {
                    uVar39 = iStack_1ac;
                  }
                  uVar39 = uVar39 >> 1;
                  goto LAB_0056dd30;
                }
                iStack_1ac = (uint)iStack_1ac >> 1;
              }
              else if (lVar28 < 0) {
                iVar25 = iStack_1ac + 1;
                iVar42 = -iVar25;
                if (0 < iVar25) {
                  iVar42 = iVar25;
                }
                iStack_1ac = ~(iVar42 / local_358.smallend.vect[0]);
              }
              else {
                iStack_1ac = iStack_1ac / local_358.smallend.vect[0];
              }
            }
            if (local_358.smallend.vect[1] != 1) {
              if (local_358.smallend.vect[1] == 4) {
                if (lVar46 < 0) {
                  aoStack_1a8._0_4_ = aoStack_1a8._0_4_ + 1;
                  uVar39 = -aoStack_1a8._0_4_;
                  if (0 < (int)aoStack_1a8._0_4_) {
                    uVar39 = aoStack_1a8._0_4_;
                  }
                  uVar39 = uVar39 >> 2;
LAB_0056dd98:
                  aoStack_1a8._0_4_ = ~uVar39;
                }
                else {
                  aoStack_1a8._0_4_ = (uint)aoStack_1a8._0_4_ >> 2;
                }
              }
              else if (local_358.smallend.vect[1] == 2) {
                if (lVar46 < 0) {
                  aoStack_1a8._0_4_ = aoStack_1a8._0_4_ + 1;
                  uVar39 = -aoStack_1a8._0_4_;
                  if (0 < (int)aoStack_1a8._0_4_) {
                    uVar39 = aoStack_1a8._0_4_;
                  }
                  uVar39 = uVar39 >> 1;
                  goto LAB_0056dd98;
                }
                aoStack_1a8._0_4_ = (uint)aoStack_1a8._0_4_ >> 1;
              }
              else if (lVar46 < 0) {
                iVar25 = aoStack_1a8._0_4_ + 1;
                iVar42 = -iVar25;
                if (0 < iVar25) {
                  iVar42 = iVar25;
                }
                aoStack_1a8._0_4_ = ~(iVar42 / local_358.smallend.vect[1]);
              }
              else {
                aoStack_1a8._0_4_ = (int)aoStack_1a8._0_4_ / local_358.smallend.vect[1];
              }
            }
            if (local_358.smallend.vect[2] != 1) {
              if (local_358.smallend.vect[2] == 4) {
                if ((int)aoStack_1a8._4_4_ < 0) {
                  aoStack_1a8._4_4_ = aoStack_1a8._4_4_ + 1;
                  uVar39 = -aoStack_1a8._4_4_;
                  if (0 < (int)aoStack_1a8._4_4_) {
                    uVar39 = aoStack_1a8._4_4_;
                  }
                  uVar39 = uVar39 >> 2;
LAB_0056de02:
                  aoStack_1a8._4_4_ = ~uVar39;
                }
                else {
                  aoStack_1a8._4_4_ = (uint)aoStack_1a8._4_4_ >> 2;
                }
              }
              else if (local_358.smallend.vect[2] == 2) {
                if ((int)aoStack_1a8._4_4_ < 0) {
                  aoStack_1a8._4_4_ = aoStack_1a8._4_4_ + 1;
                  uVar39 = -aoStack_1a8._4_4_;
                  if (0 < (int)aoStack_1a8._4_4_) {
                    uVar39 = aoStack_1a8._4_4_;
                  }
                  uVar39 = uVar39 >> 1;
                  goto LAB_0056de02;
                }
                aoStack_1a8._4_4_ = (uint)aoStack_1a8._4_4_ >> 1;
              }
              else if ((int)aoStack_1a8._4_4_ < 0) {
                iVar25 = aoStack_1a8._4_4_ + 1;
                iVar42 = -iVar25;
                if (0 < iVar25) {
                  iVar42 = iVar25;
                }
                aoStack_1a8._4_4_ = ~(iVar42 / local_358.smallend.vect[2]);
              }
              else {
                aoStack_1a8._4_4_ = (int)aoStack_1a8._4_4_ / local_358.smallend.vect[2];
              }
            }
            iStack_1ac = iStack_1ac + local_258.smallend.vect[0];
            aoStack_1a8._0_4_ = aoStack_1a8._0_4_ + local_258.smallend.vect[1];
            aoStack_1a8._4_4_ = aoStack_1a8._4_4_ + local_258.smallend.vect[2];
          }
        }
        bVar22 = Box::operator==((Box *)local_1b8,
                                 &(local_300->
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar47 - 2].domain);
        dVar48 = local_260;
        if (bVar22) break;
        piVar3 = (local_2d0->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_2e8;
        *piVar3 = *piVar3 + 1;
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        emplace_back<amrex::Box_const&,amrex::RealBox_const&,int_const&,std::array<int,3ul>const&>
                  ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
                   ((long)&(((local_270->
                             super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                             ).
                             super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                           _M_impl.super__Vector_impl_data._M_start + (long)local_260),
                   (Box *)local_1b8,(RealBox *)local_268,&local_294,&local_1e0);
        pVVar20 = local_308;
        std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::push_back
                  ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   ((long)&(((local_308->
                             super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                             ).
                             super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           _M_impl.super__Vector_impl_data._M_start + (long)dVar48),
                   (value_type *)
                   ((long)&(((local_2c0->
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                   (long)local_2e0));
        BoxArray::coarsen((BoxArray *)
                          (*(long *)((long)&(((pVVar20->
                                              super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                              ).
                                              super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                            ).
                                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                    (long)dVar48) + -0x68),&local_358.smallend);
        std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
        push_back((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *
                  )((long)&(((local_2d8->
                             super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                             ).
                             super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           ).
                           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)dVar48),
                  (value_type *)
                  ((long)&(((local_278->
                            super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ).
                            super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                          super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + (long)local_2c8));
        local_358.smallend.vect[1] = local_358.smallend.vect[1] * local_20c;
        local_358.smallend.vect[0] = local_358.smallend.vect[0] * local_208;
        local_358.smallend.vect[2] = local_358.smallend.vect[2] * local_210;
        bVar22 = iVar34 == 0;
        iVar34 = iVar34 + 1;
      } while (bVar22);
      uVar39 = (this->info).hidden_direction;
      iVar34 = -(uVar39 - 3);
      if (2 < uVar39) {
        iVar34 = 0;
      }
      (this->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar47 - 2] = *(int *)((long)local_358.smallend.vect + (ulong)(uint)(iVar34 << 2));
      bVar22 = 2 < (long)uVar47;
      uVar47 = local_2e8;
    } while (bVar22);
  }
  *(local_2d0->super_vector<int,_std::allocator<int>_>).
   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 1;
  pvVar7 = (vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
           (local_270->
           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ).
           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar29 = (local_300->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar4._M_current = *(Geometry **)(pvVar7 + 8);
  if (iVar4._M_current == *(Geometry **)(pvVar7 + 0x10)) {
    std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
    _M_realloc_insert<amrex::Geometry_const&>(pvVar7,iVar4,pGVar29);
  }
  else {
    memcpy(iVar4._M_current,pGVar29,200);
    *(long *)(pvVar7 + 8) = *(long *)(pvVar7 + 8) + 200;
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::push_back
            (&((local_308->
               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
             (local_2c0->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::push_back
            (&((local_2d8->
               super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,
             (local_278->
             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>).
             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
             ._M_impl.super__Vector_impl_data._M_start);
  ppFVar5 = (local_1c0->
            super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ).
            super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar45 = (vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
             *)(local_1c8->
               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
               ).
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(local_1c0->
            super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ).
            super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 < 1) {
    local_1b8._0_8_ = operator_new(8);
    ((FabFactory<amrex::FArrayBox> *)local_1b8._0_8_)->_vptr_FabFactory =
         (_func_int **)&PTR__FabFactory_0074e8d0;
    std::
    vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
    ::
    emplace_back<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>
              (pvVar45,(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)local_1b8);
    if ((FabFactory<amrex::FArrayBox> *)local_1b8._0_8_ != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*(*(_func_int ***)local_1b8._0_8_)[1])();
    }
  }
  else {
    local_1b8._0_4_ = (*(*ppFVar5)->_vptr_FabFactory[5])();
    local_1b8._4_4_ = extraout_var_00;
    iVar8._M_current =
         *(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           **)(pvVar45 + 8);
    if (iVar8._M_current ==
        *(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          **)(pvVar45 + 0x10)) {
      std::
      vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
      ::_M_realloc_insert<amrex::FabFactory<amrex::FArrayBox>*>
                (pvVar45,iVar8,(FabFactory<amrex::FArrayBox> **)local_1b8);
    }
    else {
      ((iVar8._M_current)->_M_t).
      super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
           (FabFactory<amrex::FArrayBox> *)local_1b8._0_8_;
      *(long *)(pvVar45 + 8) = *(long *)(pvVar45 + 8) + 8;
    }
  }
  pVVar1 = &this->m_domain_covered;
  local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&pVVar1->super_vector<int,_std::allocator<int>_>,(long)this->m_num_amr_levels,
             (value_type_conflict *)local_1b8);
  LVar30 = BoxArray::numPts(*(BoxArray **)
                             &(((this->m_grids).
                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)
  ;
  compactify((Box *)local_1b8,this,
             (Box *)(*(long *)&(((this->m_geom).
                                 super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                    + 0xac));
  *(this->m_domain_covered).super_vector<int,_std::allocator<int>_>.
   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (uint)(LVar30 ==
             (long)((aoStack_1a8._4_4_ - local_1b8._8_4_) + 1) *
             (long)((iStack_1ac - (int)local_1b8._0_8_) + 1) *
             (long)((aoStack_1a8._0_4_ - SUB84(local_1b8._0_8_,4)) + 1));
  if (1 < this->m_num_amr_levels) {
    lVar28 = 1;
    lVar46 = 6;
    do {
      if ((pVVar1->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar28 + -1] == 0) break;
      LVar31 = BoxArray::numPts(*(BoxArray **)
                                 ((long)&(((this->m_grids).
                                           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         ).
                                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar46 * 4));
      compactify((Box *)local_1b8,this,
                 (Box *)(*(long *)((long)&(((this->m_geom).
                                            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                            .
                                            super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                          ).
                                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar46 * 4) +
                        0xac));
      (this->m_domain_covered).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[lVar28]
           = (uint)(LVar31 ==
                   (long)((aoStack_1a8._4_4_ - local_1b8._8_4_) + 1) *
                   (long)((iStack_1ac - (int)local_1b8._0_8_) + 1) *
                   (long)((aoStack_1a8._0_4_ - SUB84(local_1b8._0_8_,4)) + 1));
      lVar28 = lVar28 + 1;
      lVar46 = lVar46 + 6;
    } while (lVar28 < this->m_num_amr_levels);
  }
  pVVar40 = local_230;
  local_258.smallend.vect._0_8_ = (FabFactory<amrex::FArrayBox> *)0x100000001;
  local_258.smallend.vect[2] = 1;
  local_258.bigend.vect[0] = 0;
  local_258.bigend.vect[1] = 0;
  local_258.bigend.vect[2] = 0;
  local_258.btype.itype = 0;
  bVar22 = true;
  if ((this->info).do_agglomeration == true) {
    if (*(pVVar1->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start == 0
       ) {
      BoxArray::minimalBox
                (&local_258,
                 *(BoxArray **)
                  &(((local_308->
                     super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                     ).
                     super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
      bVar22 = (long)((local_258.bigend.vect[2] - local_258.smallend.vect[2]) + 1) *
               (long)((local_258.bigend.vect[0] - local_258.smallend.vect[0]) + 1) *
               (long)((local_258.bigend.vect[1] - local_258.smallend.vect[1]) + 1) - LVar30 != 0;
    }
    else {
      lVar28 = *(long *)&(((this->m_geom).
                           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      local_258.bigend.vect[1] = (int)((ulong)*(undefined8 *)(lVar28 + 0xb8) >> 0x20);
      local_258.bigend.vect[2] = (int)*(undefined8 *)(lVar28 + 0xc0);
      local_258.btype.itype = (uint)((ulong)*(undefined8 *)(lVar28 + 0xc0) >> 0x20);
      local_258.smallend.vect._0_8_ = *(FabFactory<amrex::FArrayBox> **)(lVar28 + 0xac);
      local_258.smallend.vect[2] = (int)*(undefined8 *)(lVar28 + 0xb4);
      local_258.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar28 + 0xb4) >> 0x20);
      uVar47 = (ulong)(uint)(this->info).hidden_direction;
      if (uVar47 < 3) {
        this_00 = *(BATransformer **)
                   &(((this->m_grids).
                      super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
        BATransformer::operator()((Box *)local_1b8,this_00,(Box *)**(undefined8 **)(this_00 + 1));
        iVar34 = *(int *)(local_1b8 + (long)(this->info).hidden_direction * 4);
        local_258.smallend.vect[uVar47] = iVar34;
        local_258.bigend.vect[uVar47] = iVar34;
      }
      bVar22 = false;
    }
  }
  if ((((this->info).do_semicoarsening == true) && ((uint)(this->info).hidden_direction < 3)) ||
     (3 < (this->info).semicoarsening_direction + 1U)) {
    Assert_host("! (info.do_semicoarsening && info.hasHiddenDimension()) && info.semicoarsening_direction >= -1 && info.semicoarsening_direction < AMREX_SPACEDIM"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLLinOp.cpp"
                ,299,(char *)0x0);
  }
  if (bVar22 || (this->info).do_agglomeration != true) {
    local_260 = 0.0;
    if ((this->info).do_consolidation == true) {
      dVar48 = BoxArray::d_numPts((local_2c0->
                                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      local_260 = dVar48 / (double)*(int *)(DAT_00756620 + -0x38);
      if ((anonymous_namespace)::consolidation_threshold == -1) {
        iVar34 = (this->info).con_grid_size;
        (anonymous_namespace)::consolidation_threshold = iVar34 * iVar34 * iVar34;
      }
    }
    pGVar6 = (local_300->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_338._M_head_impl = (FabFactory<amrex::FArrayBox> *)0x100000001;
    IStack_330.itype = 1;
    local_2e8 = local_2e8 & 0xffffffff00000000;
    if ((this->info).max_coarsening_level < 1) {
      local_2c8 = (double)((ulong)local_2c8._4_4_ << 0x20);
      local_2e0 = 0.0;
    }
    else {
      local_2e0 = 0.0;
      iVar34 = 0;
      local_300 = (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                  ((ulong)local_300 & 0xffffffff00000000);
      local_2c8 = (double)((ulong)local_2c8._4_4_ << 0x20);
      do {
        local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,local_2ec);
        local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_start = local_2f4;
        bVar38 = (int)local_300 < (this->info).max_semicoarsening_level &
                 (this->info).do_semicoarsening;
        if ((bVar38 == 1) && (lVar28 = (long)(this->info).semicoarsening_direction, lVar28 != -1)) {
          *(undefined4 *)
           ((long)&local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar28 * 4) = 1;
        }
        local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                              _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        lVar28 = 0;
        do {
          local_1b8._0_8_ =
               (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                )0x100000001;
          local_1b8._8_4_ = 1;
          *(int *)(local_1b8 + lVar28 * 4) =
               *(int *)((long)&local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar28 * 4) *
               *(int *)((long)&local_338._M_head_impl + lVar28 * 4);
          bVar22 = Box::coarsenable(&pGVar6->domain,(IntVect *)local_1b8,&local_1d4);
          uVar39 = 0;
          if (bVar22) {
            bVar22 = BoxArray::coarsenable
                               ((local_2c0->
                                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                ._M_impl.super__Vector_impl_data._M_start,(IntVect *)local_1b8,
                                &local_204);
            uVar39 = (uint)bVar22;
          }
          *(uint *)((long)&local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar28 * 4) = uVar39;
          if (((char)uVar39 == '\0' && bVar38 == 1) && ((this->info).semicoarsening_direction == -1)
             ) {
            *(undefined4 *)
             ((long)&local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar28 * 4) = 1;
            *(undefined4 *)
             ((long)&local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar28 * 4) = 1;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        bVar22 = false;
        if ((((int)local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start == 1) &&
            (bVar22 = false,
            local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ == 1)) &&
           ((int)local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish == 1)) {
          if ((((int)local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start == 1) &&
              (local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_ == 1)) &&
             ((uint)local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish == 1)) {
            bVar22 = false;
          }
          else if (((bVar38 & (this->info).semicoarsening_direction == -1) != 1) ||
                  (bVar22 = (byte)(((uint)local_2b8.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_finish == 1) +
                                  (local_2b8.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_ == 1) +
                                  ((int)local_2b8.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_start == 1)) < 2, bVar22)
                  ) {
            uVar39 = 1;
            if (((int)local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start == (int)local_2f4) &&
               (local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_ == local_2f4._4_4_)) {
              uVar39 = (uint)((uint)local_2b8.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish != local_2ec);
            }
            iVar42 = (int)local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                          _M_impl.super__Vector_impl_data._M_start * (uint)local_338._M_head_impl;
            local_338._M_head_impl._4_4_ =
                 local_338._M_head_impl._4_4_ *
                 local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_;
            local_338._M_head_impl._0_4_ = iVar42;
            IStack_330.itype =
                 IStack_330.itype *
                 (uint)local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_finish;
            pvVar7 = (vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
                     (local_270->
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ).
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            _Var19.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl
                 = *(_Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> *)
                    (pGVar6->domain).smallend.vect;
            lVar28 = *(long *)((pGVar6->domain).smallend.vect + 2);
            lVar46 = *(long *)(pGVar6->domain).bigend.vect;
            uVar32 = *(undefined8 *)((pGVar6->domain).bigend.vect + 2);
            aoStack_1a8._0_4_ = (undefined4)((ulong)lVar46 >> 0x20);
            aoStack_1a8._4_4_ = (undefined4)uVar32;
            auStack_1a0[0]._0_4_ = (undefined4)((ulong)uVar32 >> 0x20);
            local_1b8._8_4_ = (undefined4)lVar28;
            iStack_1ac = (int)((ulong)lVar28 >> 0x20);
            local_1b8._0_8_ =
                 _Var19.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                 _M_head_impl;
            if (IStack_330.itype != 1 || (local_338._M_head_impl._4_4_ != 1 || iVar42 != 1)) {
              local_1b8._0_4_ =
                   _Var19.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                   _M_head_impl._0_4_;
              if (iVar42 != 1) {
                if (iVar42 == 4) {
                  if ((int)local_1b8._0_4_ < 0) {
                    uVar24 = local_1b8._0_4_ + indexType;
                    uVar37 = -uVar24;
                    if (0 < (int)uVar24) {
                      uVar37 = uVar24;
                    }
                    uVar37 = uVar37 >> 2;
LAB_0056e80f:
                    local_1b8._0_4_ = ~uVar37;
                  }
                  else {
                    local_1b8._0_4_ = (uint)local_1b8._0_4_ >> 2;
                  }
                }
                else if (iVar42 == 2) {
                  if ((int)local_1b8._0_4_ < 0) {
                    uVar24 = local_1b8._0_4_ + indexType;
                    uVar37 = -uVar24;
                    if (0 < (int)uVar24) {
                      uVar37 = uVar24;
                    }
                    uVar37 = uVar37 >> 1;
                    goto LAB_0056e80f;
                  }
                  local_1b8._0_4_ = (uint)local_1b8._0_4_ >> 1;
                }
                else if ((int)local_1b8._0_4_ < 0) {
                  iVar35 = local_1b8._0_4_ + indexType;
                  iVar25 = -iVar35;
                  if (0 < iVar35) {
                    iVar25 = iVar35;
                  }
                  local_1b8._0_4_ = ~(iVar25 / iVar42);
                }
                else {
                  local_1b8._0_4_ = (int)local_1b8._0_4_ / iVar42;
                }
              }
              local_1b8._4_4_ =
                   _Var19.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                   _M_head_impl._4_4_;
              if (local_338._M_head_impl._4_4_ != 1) {
                if (local_338._M_head_impl._4_4_ == 4) {
                  if ((long)_Var19.
                            super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl < 0) {
                    uVar24 = local_1b8._4_4_ + 1;
                    uVar37 = -uVar24;
                    if (0 < (int)uVar24) {
                      uVar37 = uVar24;
                    }
                    uVar37 = uVar37 >> 2;
LAB_0056e879:
                    local_1b8._4_4_ = ~uVar37;
                  }
                  else {
                    local_1b8._4_4_ = (uint)local_1b8._4_4_ >> 2;
                  }
                }
                else if (local_338._M_head_impl._4_4_ == 2) {
                  if ((long)_Var19.
                            super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl < 0) {
                    uVar24 = local_1b8._4_4_ + 1;
                    uVar37 = -uVar24;
                    if (0 < (int)uVar24) {
                      uVar37 = uVar24;
                    }
                    uVar37 = uVar37 >> 1;
                    goto LAB_0056e879;
                  }
                  local_1b8._4_4_ = (uint)local_1b8._4_4_ >> 1;
                }
                else if ((long)_Var19.
                               super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                               _M_head_impl < 0) {
                  iVar35 = local_1b8._4_4_ + 1;
                  iVar25 = -iVar35;
                  if (0 < iVar35) {
                    iVar25 = iVar35;
                  }
                  local_1b8._4_4_ = ~(iVar25 / (int)local_338._M_head_impl._4_4_);
                }
                else {
                  local_1b8._4_4_ = (int)local_1b8._4_4_ / (int)local_338._M_head_impl._4_4_;
                }
              }
              if (IStack_330.itype != 1) {
                if (IStack_330.itype == 4) {
                  if ((int)local_1b8._8_4_ < 0) {
                    uVar24 = local_1b8._8_4_ + 1;
                    uVar37 = -uVar24;
                    if (0 < (int)uVar24) {
                      uVar37 = uVar24;
                    }
                    uVar37 = uVar37 >> 2;
LAB_0056e8e4:
                    local_1b8._8_4_ = ~uVar37;
                  }
                  else {
                    local_1b8._8_4_ = (uint)local_1b8._8_4_ >> 2;
                  }
                }
                else if (IStack_330.itype == 2) {
                  if ((int)local_1b8._8_4_ < 0) {
                    uVar24 = local_1b8._8_4_ + 1;
                    uVar37 = -uVar24;
                    if (0 < (int)uVar24) {
                      uVar37 = uVar24;
                    }
                    uVar37 = uVar37 >> 1;
                    goto LAB_0056e8e4;
                  }
                  local_1b8._8_4_ = (uint)local_1b8._8_4_ >> 1;
                }
                else if ((int)local_1b8._8_4_ < 0) {
                  iVar35 = local_1b8._8_4_ + 1;
                  iVar25 = -iVar35;
                  if (0 < iVar35) {
                    iVar25 = iVar35;
                  }
                  local_1b8._8_4_ = ~(iVar25 / IStack_330.itype);
                }
                else {
                  local_1b8._8_4_ = (int)local_1b8._8_4_ / (int)IStack_330.itype;
                }
              }
              if ((undefined4)auStack_1a0[0] == 0) {
                if (iVar42 != 1) {
                  if (iVar42 == 4) {
                    if (lVar28 < 0) {
                      iStack_1ac = iStack_1ac + 1;
                      uVar37 = -iStack_1ac;
                      if (0 < iStack_1ac) {
                        uVar37 = iStack_1ac;
                      }
                      uVar37 = uVar37 >> 2;
LAB_0056ec53:
                      iStack_1ac = ~uVar37;
                    }
                    else {
                      iStack_1ac = (uint)iStack_1ac >> 2;
                    }
                  }
                  else if (iVar42 == 2) {
                    if (lVar28 < 0) {
                      iStack_1ac = iStack_1ac + 1;
                      uVar37 = -iStack_1ac;
                      if (0 < iStack_1ac) {
                        uVar37 = iStack_1ac;
                      }
                      uVar37 = uVar37 >> 1;
                      goto LAB_0056ec53;
                    }
                    iStack_1ac = (uint)iStack_1ac >> 1;
                  }
                  else if (lVar28 < 0) {
                    iVar35 = iStack_1ac + 1;
                    iVar25 = -iVar35;
                    if (0 < iVar35) {
                      iVar25 = iVar35;
                    }
                    iStack_1ac = ~(iVar25 / iVar42);
                  }
                  else {
                    iStack_1ac = iStack_1ac / iVar42;
                  }
                }
                if (local_338._M_head_impl._4_4_ != 1) {
                  if (local_338._M_head_impl._4_4_ == 4) {
                    if (lVar46 < 0) {
                      aoStack_1a8._0_4_ = aoStack_1a8._0_4_ + 1;
                      uVar37 = -aoStack_1a8._0_4_;
                      if (0 < (int)aoStack_1a8._0_4_) {
                        uVar37 = aoStack_1a8._0_4_;
                      }
                      uVar37 = uVar37 >> 2;
LAB_0056ecbd:
                      aoStack_1a8._0_4_ = ~uVar37;
                    }
                    else {
                      aoStack_1a8._0_4_ = (uint)aoStack_1a8._0_4_ >> 2;
                    }
                  }
                  else if (local_338._M_head_impl._4_4_ == 2) {
                    if (lVar46 < 0) {
                      aoStack_1a8._0_4_ = aoStack_1a8._0_4_ + 1;
                      uVar37 = -aoStack_1a8._0_4_;
                      if (0 < (int)aoStack_1a8._0_4_) {
                        uVar37 = aoStack_1a8._0_4_;
                      }
                      uVar37 = uVar37 >> 1;
                      goto LAB_0056ecbd;
                    }
                    aoStack_1a8._0_4_ = (uint)aoStack_1a8._0_4_ >> 1;
                  }
                  else if (lVar46 < 0) {
                    iVar25 = aoStack_1a8._0_4_ + 1;
                    iVar42 = -iVar25;
                    if (0 < iVar25) {
                      iVar42 = iVar25;
                    }
                    aoStack_1a8._0_4_ = ~(iVar42 / (int)local_338._M_head_impl._4_4_);
                  }
                  else {
                    aoStack_1a8._0_4_ = (int)aoStack_1a8._0_4_ / (int)local_338._M_head_impl._4_4_;
                  }
                }
                if (IStack_330.itype != 1) {
                  if (IStack_330.itype == 4) {
                    if ((int)aoStack_1a8._4_4_ < 0) {
                      aoStack_1a8._4_4_ = aoStack_1a8._4_4_ + 1;
                      uVar37 = -aoStack_1a8._4_4_;
                      if (0 < (int)aoStack_1a8._4_4_) {
                        uVar37 = aoStack_1a8._4_4_;
                      }
                      uVar37 = uVar37 >> 2;
LAB_0056ed35:
                      aoStack_1a8._4_4_ = ~uVar37;
                    }
                    else {
                      aoStack_1a8._4_4_ = (uint)aoStack_1a8._4_4_ >> 2;
                    }
                  }
                  else if (IStack_330.itype == 2) {
                    if ((int)aoStack_1a8._4_4_ < 0) {
                      aoStack_1a8._4_4_ = aoStack_1a8._4_4_ + 1;
                      uVar37 = -aoStack_1a8._4_4_;
                      if (0 < (int)aoStack_1a8._4_4_) {
                        uVar37 = aoStack_1a8._4_4_;
                      }
                      uVar37 = uVar37 >> 1;
                      goto LAB_0056ed35;
                    }
                    aoStack_1a8._4_4_ = (uint)aoStack_1a8._4_4_ >> 1;
                  }
                  else if ((int)aoStack_1a8._4_4_ < 0) {
                    iVar25 = aoStack_1a8._4_4_ + 1;
                    iVar42 = -iVar25;
                    if (0 < iVar25) {
                      iVar42 = iVar25;
                    }
                    aoStack_1a8._4_4_ = ~(iVar42 / IStack_330.itype);
                  }
                  else {
                    aoStack_1a8._4_4_ = (int)aoStack_1a8._4_4_ / (int)IStack_330.itype;
                  }
                }
              }
              else {
                local_358.smallend.vect._0_8_ = (pointer)0x0;
                local_358.smallend.vect[2] = 0;
                lVar44 = 0;
                do {
                  if ((((uint)(undefined4)auStack_1a0[0] >> ((uint)lVar44 & 0x1f) & 1) != 0) &&
                     ((&iStack_1ac)[lVar44] % *(int *)((long)&local_338._M_head_impl + lVar44 * 4)
                      != 0)) {
                    local_358.smallend.vect[lVar44] = 1;
                  }
                  lVar44 = lVar44 + 1;
                } while (lVar44 != 3);
                if (iVar42 != 1) {
                  if (iVar42 == 4) {
                    if (lVar28 < 0) {
                      iStack_1ac = iStack_1ac + 1;
                      uVar37 = -iStack_1ac;
                      if (0 < iStack_1ac) {
                        uVar37 = iStack_1ac;
                      }
                      uVar37 = uVar37 >> 2;
LAB_0056e9e6:
                      iStack_1ac = ~uVar37;
                    }
                    else {
                      iStack_1ac = (uint)iStack_1ac >> 2;
                    }
                  }
                  else if (iVar42 == 2) {
                    if (lVar28 < 0) {
                      iStack_1ac = iStack_1ac + 1;
                      uVar37 = -iStack_1ac;
                      if (0 < iStack_1ac) {
                        uVar37 = iStack_1ac;
                      }
                      uVar37 = uVar37 >> 1;
                      goto LAB_0056e9e6;
                    }
                    iStack_1ac = (uint)iStack_1ac >> 1;
                  }
                  else if (lVar28 < 0) {
                    iVar35 = iStack_1ac + 1;
                    iVar25 = -iVar35;
                    if (0 < iVar35) {
                      iVar25 = iVar35;
                    }
                    iStack_1ac = ~(iVar25 / iVar42);
                  }
                  else {
                    iStack_1ac = iStack_1ac / iVar42;
                  }
                }
                if (local_338._M_head_impl._4_4_ != 1) {
                  if (local_338._M_head_impl._4_4_ == 4) {
                    if (lVar46 < 0) {
                      aoStack_1a8._0_4_ = aoStack_1a8._0_4_ + 1;
                      uVar37 = -aoStack_1a8._0_4_;
                      if (0 < (int)aoStack_1a8._0_4_) {
                        uVar37 = aoStack_1a8._0_4_;
                      }
                      uVar37 = uVar37 >> 2;
LAB_0056ea52:
                      aoStack_1a8._0_4_ = ~uVar37;
                    }
                    else {
                      aoStack_1a8._0_4_ = (uint)aoStack_1a8._0_4_ >> 2;
                    }
                  }
                  else if (local_338._M_head_impl._4_4_ == 2) {
                    if (lVar46 < 0) {
                      aoStack_1a8._0_4_ = aoStack_1a8._0_4_ + 1;
                      uVar37 = -aoStack_1a8._0_4_;
                      if (0 < (int)aoStack_1a8._0_4_) {
                        uVar37 = aoStack_1a8._0_4_;
                      }
                      uVar37 = uVar37 >> 1;
                      goto LAB_0056ea52;
                    }
                    aoStack_1a8._0_4_ = (uint)aoStack_1a8._0_4_ >> 1;
                  }
                  else if (lVar46 < 0) {
                    iVar25 = aoStack_1a8._0_4_ + 1;
                    iVar42 = -iVar25;
                    if (0 < iVar25) {
                      iVar42 = iVar25;
                    }
                    aoStack_1a8._0_4_ = ~(iVar42 / (int)local_338._M_head_impl._4_4_);
                  }
                  else {
                    aoStack_1a8._0_4_ = (int)aoStack_1a8._0_4_ / (int)local_338._M_head_impl._4_4_;
                  }
                }
                if (IStack_330.itype != 1) {
                  if (IStack_330.itype == 4) {
                    if ((int)aoStack_1a8._4_4_ < 0) {
                      aoStack_1a8._4_4_ = aoStack_1a8._4_4_ + 1;
                      uVar37 = -aoStack_1a8._4_4_;
                      if (0 < (int)aoStack_1a8._4_4_) {
                        uVar37 = aoStack_1a8._4_4_;
                      }
                      uVar37 = uVar37 >> 2;
LAB_0056eabd:
                      aoStack_1a8._4_4_ = ~uVar37;
                    }
                    else {
                      aoStack_1a8._4_4_ = (uint)aoStack_1a8._4_4_ >> 2;
                    }
                  }
                  else if (IStack_330.itype == 2) {
                    if ((int)aoStack_1a8._4_4_ < 0) {
                      aoStack_1a8._4_4_ = aoStack_1a8._4_4_ + 1;
                      uVar37 = -aoStack_1a8._4_4_;
                      if (0 < (int)aoStack_1a8._4_4_) {
                        uVar37 = aoStack_1a8._4_4_;
                      }
                      uVar37 = uVar37 >> 1;
                      goto LAB_0056eabd;
                    }
                    aoStack_1a8._4_4_ = (uint)aoStack_1a8._4_4_ >> 1;
                  }
                  else if ((int)aoStack_1a8._4_4_ < 0) {
                    iVar25 = aoStack_1a8._4_4_ + 1;
                    iVar42 = -iVar25;
                    if (0 < iVar25) {
                      iVar42 = iVar25;
                    }
                    aoStack_1a8._4_4_ = ~(iVar42 / IStack_330.itype);
                  }
                  else {
                    aoStack_1a8._4_4_ = (int)aoStack_1a8._4_4_ / (int)IStack_330.itype;
                  }
                }
                iStack_1ac = iStack_1ac + local_358.smallend.vect[0];
                aoStack_1a8._0_4_ = aoStack_1a8._0_4_ + local_358.smallend.vect[1];
                aoStack_1a8._4_4_ = aoStack_1a8._4_4_ + local_358.smallend.vect[2];
              }
            }
            std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
            emplace_back<amrex::Box,amrex::RealBox_const&,int_const&,std::array<int,3ul>const&>
                      (pvVar7,(Box *)local_1b8,(RealBox *)local_268,&local_294,&local_1e0);
            pvVar9 = &((local_308->
                       super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       ).
                       super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
            amrex::coarsen((BoxArray *)local_1b8,
                           (local_2c0->
                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           _M_impl.super__Vector_impl_data._M_start,(IntVect *)&local_338);
            std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::
            emplace_back<amrex::BoxArray>(pvVar9,(BoxArray *)local_1b8);
            local_300 = (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        CONCAT44(local_300._4_4_,(int)local_300 + uVar39);
            BoxArray::~BoxArray((BoxArray *)local_1b8);
            if ((this->info).do_consolidation == true) {
              pvVar10 = &((local_2d8->
                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ).
                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
              ;
              pDVar11 = (pvVar10->
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              if ((double)(anonymous_namespace)::consolidation_threshold * 0.999 <=
                  local_260 /
                  (double)(int)(local_338._M_head_impl._4_4_ * (uint)local_338._M_head_impl *
                               IStack_330.itype)) {
                std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ::push_back(pvVar10,pDVar11 + -1);
              }
              else {
                pDVar12 = (pvVar10->
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                DistributionMapping::DistributionMapping((DistributionMapping *)local_1b8);
                std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ::emplace_back<amrex::DistributionMapping>(pvVar10,(DistributionMapping *)local_1b8)
                ;
                uVar32 = extraout_RAX;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    CONCAT44(iStack_1ac,local_1b8._8_4_) !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             CONCAT44(iStack_1ac,local_1b8._8_4_));
                  uVar32 = extraout_RAX_00;
                }
                local_2e0 = (double)CONCAT71((int7)((ulong)uVar32 >> 8),1);
                local_2c8 = (double)CONCAT44(local_2c8._4_4_,
                                             (int)((ulong)((long)pDVar11 - (long)pDVar12) >> 4));
              }
              bVar22 = true;
            }
            else {
              std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
              push_back(&((local_2d8->
                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ).
                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ,(local_278->
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         ).
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         ._M_impl.super__Vector_impl_data._M_start);
              bVar22 = true;
            }
          }
        }
        pVVar40 = local_230;
      } while ((bVar22) && (iVar34 = iVar34 + 1, iVar34 < (this->info).max_coarsening_level));
    }
    bVar22 = false;
  }
  else {
    lVar28 = *(long *)&(((this->m_geom).
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    local_358.smallend.vect._0_8_ = *(ulong *)(lVar28 + 0xac);
    local_358._20_8_ = *(undefined8 *)(lVar28 + 0xc0);
    local_358.bigend.vect[1] = (int)((ulong)*(undefined8 *)(lVar28 + 0xb8) >> 0x20);
    local_358.smallend.vect[2] = (int)*(undefined8 *)(lVar28 + 0xb4);
    local_358.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar28 + 0xb4) >> 0x20);
    IStack_320.itype = local_258.btype.itype;
    auStack_32c[2] = local_258.bigend.vect[2];
    auStack_32c[1] = local_258.bigend.vect[1];
    local_338._M_head_impl = (FabFactory<amrex::FArrayBox> *)local_258.smallend.vect._0_8_;
    IStack_330.itype = local_258.smallend.vect[2];
    auStack_32c[0] = local_258.bigend.vect[0];
    plVar13 = *(long **)(*(long *)&(((this->m_grids).
                                     super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                        + 0x48);
    lVar46 = plVar13[1];
    lVar44 = *plVar13;
    iVar34 = (this->info).agg_grid_size;
    local_1b8._0_8_ =
         ((__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           *)(lVar28 + 0xac))->_M_t;
    aoStack_1a8._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar28 + 0xb8) >> 0x20);
    aoStack_1a8._4_4_ = (undefined4)*(undefined8 *)(lVar28 + 0xc0);
    auStack_1a0[0]._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar28 + 0xc0) >> 0x20);
    local_1b8._8_4_ = (undefined4)*(undefined8 *)(lVar28 + 0xb4);
    iStack_1ac = (int)((ulong)*(undefined8 *)(lVar28 + 0xb4) >> 0x20);
    __l._M_len = 1;
    __l._M_array = (iterator)local_1b8;
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
              (&local_2b8,__l,(allocator_type *)&local_290);
    aoStack_1a8[0] = (ostringstream)(undefined1)auStack_32c[1];
    aoStack_1a8[1] = (ostringstream)auStack_32c[1]._1_1_;
    aoStack_1a8[2] = (ostringstream)auStack_32c[1]._2_1_;
    aoStack_1a8[3] = (ostringstream)auStack_32c[1]._3_1_;
    aoStack_1a8._4_4_ = (undefined4)stack0xfffffffffffffcdc;
    auStack_1a0[0]._0_4_ = SUB84(stack0xfffffffffffffcdc,4);
    local_1b8._0_8_ = local_338._M_head_impl;
    local_1b8._8_4_ = IStack_330.itype;
    iStack_1ac = auStack_32c[0];
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_1b8;
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
              (&local_290,__l_00,(allocator_type *)&local_1f8);
    local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_1b8;
    std::vector<int,_std::allocator<int>_>::vector(&local_1f8,__l_01,(allocator_type *)&local_228);
    local_1b8._0_8_ =
         (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          )0x100000001;
    local_1b8._8_4_ = 1;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)local_1b8;
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
              (&local_228,__l_02,(allocator_type *)&local_318);
    if (0 < (this->info).max_coarsening_level) {
      local_2e0 = (double)((lVar46 - lVar44 >> 2) * 0x6db6db6db6db6db7);
      local_2c8 = (double)(iVar34 * iVar34 * iVar34) * 0.999;
      iVar34 = 0;
      iVar42 = 0;
      do {
        local_318.vect[2] = local_2ec;
        local_318.vect._0_8_ = local_2f4;
        bVar38 = iVar34 < (this->info).max_semicoarsening_level & (this->info).do_semicoarsening;
        if ((bVar38 == 1) && (lVar28 = (long)(this->info).semicoarsening_direction, lVar28 != -1)) {
          local_318.vect[lVar28] = 1;
        }
        local_2a0.vect[0] = 0;
        local_2a0.vect[1] = 0;
        local_2a0.vect[2] = 0;
        lVar28 = 0;
        do {
          local_1b8._0_8_ =
               (_Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                )0x100000001;
          local_1b8._8_4_ = 1;
          *(int *)(local_1b8 + lVar28 * 4) = local_318.vect[lVar28];
          bVar22 = Box::coarsenable(&local_358,(IntVect *)local_1b8,&local_1d4);
          uVar39 = 0;
          if (bVar22) {
            bVar22 = Box::coarsenable((Box *)&local_338,(IntVect *)local_1b8,&local_204);
            uVar39 = (uint)bVar22;
          }
          local_2a0.vect[lVar28] = uVar39;
          if (((char)uVar39 == '\0' && bVar38 == 1) && ((this->info).semicoarsening_direction == -1)
             ) {
            local_2a0.vect[lVar28] = 1;
            local_318.vect[lVar28] = 1;
          }
          iVar25 = local_318.vect[2];
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        bVar22 = false;
        if (((local_2a0.vect[0] == 1) && (bVar22 = false, local_2a0.vect[1] == 1)) &&
           (local_2a0.vect[2] == 1)) {
          iVar35 = local_318.vect[0];
          iVar26 = local_318.vect[1];
          if (((local_318.vect[0] == 1) && (local_318.vect[1] == 1)) && (local_318.vect[2] == 1)) {
            bVar22 = false;
          }
          else if (((bVar38 & (this->info).semicoarsening_direction == -1) != 1) ||
                  (bVar22 = (byte)((local_318.vect[2] == 1U) +
                                  (local_318.vect[1] == 1) + (local_318.vect[0] == 1)) < 2, bVar22))
          {
            local_300 = (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        CONCAT44(local_300._4_4_,1);
            if ((local_318.vect[0] == (int)local_2f4) && (local_318.vect[1] == local_2f4._4_4_)) {
              local_300 = (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                          CONCAT44(local_300._4_4_,(uint)(local_318.vect[2] != local_2ec));
            }
            local_1b8._8_4_ =
                 local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1].vect[2] * local_318.vect[2];
            local_1b8._4_4_ =
                 local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1].vect[1] * local_318.vect[1];
            local_1b8._0_4_ =
                 local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1].vect[0] * local_318.vect[0];
            if (local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::
              _M_realloc_insert<amrex::IntVect>
                        (&local_228,
                         (iterator)
                         local_228.
                         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
                         .super__Vector_impl_data._M_finish,(IntVect *)local_1b8);
            }
            else {
              (local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
               .super__Vector_impl_data._M_finish)->vect[2] = local_1b8._8_4_;
              *(undefined8 *)
               (local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                _M_impl.super__Vector_impl_data._M_finish)->vect = local_1b8._0_8_;
              local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_2e8 = CONCAT71(local_2e8._1_7_,iVar26 == 1 && iVar35 == 1);
            if ((iVar26 != 1 || iVar35 != 1) || iVar25 != 1) {
              uVar39 = local_358.smallend.vect[0];
              if (iVar35 != 1) {
                if (iVar35 == 4) {
                  if (local_358.smallend.vect[0] < 0) {
                    uVar37 = local_358.smallend.vect[0] + 1;
                    uVar39 = -uVar37;
                    if (0 < (int)uVar37) {
                      uVar39 = uVar37;
                    }
                    uVar39 = uVar39 >> 2;
LAB_0056f164:
                    uVar39 = ~uVar39;
                  }
                  else {
                    uVar39 = (uint)local_358.smallend.vect[0] >> 2;
                  }
                }
                else if (iVar35 == 2) {
                  if (local_358.smallend.vect[0] < 0) {
                    uVar37 = local_358.smallend.vect[0] + 1;
                    uVar39 = -uVar37;
                    if (0 < (int)uVar37) {
                      uVar39 = uVar37;
                    }
                    uVar39 = uVar39 >> 1;
                    goto LAB_0056f164;
                  }
                  uVar39 = (uint)local_358.smallend.vect[0] >> 1;
                }
                else if (local_358.smallend.vect[0] < 0) {
                  iVar36 = local_358.smallend.vect[0] + 1;
                  iVar43 = -iVar36;
                  if (0 < iVar36) {
                    iVar43 = iVar36;
                  }
                  uVar39 = ~(iVar43 / iVar35);
                }
                else {
                  uVar39 = local_358.smallend.vect[0] / iVar35;
                }
              }
              if (iVar26 != 1) {
                if (iVar26 == 4) {
                  if ((long)local_358.smallend.vect._0_8_ < 0) {
                    local_358.smallend.vect[1] = local_358.smallend.vect[1] + 1;
                    uVar37 = -local_358.smallend.vect[1];
                    if (0 < local_358.smallend.vect[1]) {
                      uVar37 = local_358.smallend.vect[1];
                    }
                    uVar37 = uVar37 >> 2;
LAB_0056f1c9:
                    local_358.smallend.vect[1] = ~uVar37;
                  }
                  else {
                    local_358.smallend.vect[1] = (uint)local_358.smallend.vect[1] >> 2;
                  }
                }
                else if (iVar26 == 2) {
                  if ((long)local_358.smallend.vect._0_8_ < 0) {
                    local_358.smallend.vect[1] = local_358.smallend.vect[1] + 1;
                    uVar37 = -local_358.smallend.vect[1];
                    if (0 < local_358.smallend.vect[1]) {
                      uVar37 = local_358.smallend.vect[1];
                    }
                    uVar37 = uVar37 >> 1;
                    goto LAB_0056f1c9;
                  }
                  local_358.smallend.vect[1] = (uint)local_358.smallend.vect[1] >> 1;
                }
                else if ((long)local_358.smallend.vect._0_8_ < 0) {
                  iVar36 = local_358.smallend.vect[1] + 1;
                  iVar43 = -iVar36;
                  if (0 < iVar36) {
                    iVar43 = iVar36;
                  }
                  local_358.smallend.vect[1] = ~(iVar43 / iVar26);
                }
                else {
                  local_358.smallend.vect[1] = local_358.smallend.vect[1] / iVar26;
                }
              }
              local_358.smallend.vect[0] = uVar39;
              if (iVar25 != 1) {
                if (iVar25 == 4) {
                  if (local_358.smallend.vect[2] < 0) {
                    local_358.smallend.vect[2] = local_358.smallend.vect[2] + 1;
                    uVar39 = -local_358.smallend.vect[2];
                    if (0 < local_358.smallend.vect[2]) {
                      uVar39 = local_358.smallend.vect[2];
                    }
                    uVar39 = uVar39 >> 2;
LAB_0056f22c:
                    local_358.smallend.vect[2] = ~uVar39;
                  }
                  else {
                    local_358.smallend.vect[2] = (uint)local_358.smallend.vect[2] >> 2;
                  }
                }
                else if (iVar25 == 2) {
                  if (local_358.smallend.vect[2] < 0) {
                    local_358.smallend.vect[2] = local_358.smallend.vect[2] + 1;
                    uVar39 = -local_358.smallend.vect[2];
                    if (0 < local_358.smallend.vect[2]) {
                      uVar39 = local_358.smallend.vect[2];
                    }
                    uVar39 = uVar39 >> 1;
                    goto LAB_0056f22c;
                  }
                  local_358.smallend.vect[2] = (uint)local_358.smallend.vect[2] >> 1;
                }
                else if (local_358.smallend.vect[2] < 0) {
                  iVar36 = local_358.smallend.vect[2] + 1;
                  iVar43 = -iVar36;
                  if (0 < iVar36) {
                    iVar43 = iVar36;
                  }
                  local_358.smallend.vect[2] = ~(iVar43 / iVar25);
                }
                else {
                  local_358.smallend.vect[2] = local_358.smallend.vect[2] / iVar25;
                }
              }
              if (local_358.btype.itype == 0) {
                if (iVar35 != 1) {
                  if (iVar35 == 4) {
                    if (local_358.bigend.vect[0] < 0) {
                      local_358.bigend.vect[0] = local_358.bigend.vect[0] + 1;
                      uVar39 = -local_358.bigend.vect[0];
                      if (0 < local_358.bigend.vect[0]) {
                        uVar39 = local_358.bigend.vect[0];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056f8a9:
                      local_358.bigend.vect[0] = ~uVar39;
                    }
                    else {
                      local_358.bigend.vect[0] = (uint)local_358.bigend.vect[0] >> 2;
                    }
                  }
                  else if (iVar35 == 2) {
                    if (local_358.bigend.vect[0] < 0) {
                      local_358.bigend.vect[0] = local_358.bigend.vect[0] + 1;
                      uVar39 = -local_358.bigend.vect[0];
                      if (0 < local_358.bigend.vect[0]) {
                        uVar39 = local_358.bigend.vect[0];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056f8a9;
                    }
                    local_358.bigend.vect[0] = (uint)local_358.bigend.vect[0] >> 1;
                  }
                  else if (local_358.bigend.vect[0] < 0) {
                    iVar36 = local_358.bigend.vect[0] + 1;
                    iVar43 = -iVar36;
                    if (0 < iVar36) {
                      iVar43 = iVar36;
                    }
                    local_358.bigend.vect[0] = ~(iVar43 / iVar35);
                  }
                  else {
                    local_358.bigend.vect[0] = local_358.bigend.vect[0] / iVar35;
                  }
                }
                if (iVar26 != 1) {
                  if (iVar26 == 4) {
                    if (local_358.bigend.vect[1] < 0) {
                      local_358.bigend.vect[1] = local_358.bigend.vect[1] + 1;
                      uVar39 = -local_358.bigend.vect[1];
                      if (0 < local_358.bigend.vect[1]) {
                        uVar39 = local_358.bigend.vect[1];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056f90e:
                      local_358.bigend.vect[1] = ~uVar39;
                    }
                    else {
                      local_358.bigend.vect[1] = (uint)local_358.bigend.vect[1] >> 2;
                    }
                  }
                  else if (iVar26 == 2) {
                    if (local_358.bigend.vect[1] < 0) {
                      local_358.bigend.vect[1] = local_358.bigend.vect[1] + 1;
                      uVar39 = -local_358.bigend.vect[1];
                      if (0 < local_358.bigend.vect[1]) {
                        uVar39 = local_358.bigend.vect[1];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056f90e;
                    }
                    local_358.bigend.vect[1] = (uint)local_358.bigend.vect[1] >> 1;
                  }
                  else if (local_358.bigend.vect[1] < 0) {
                    iVar36 = local_358.bigend.vect[1] + 1;
                    iVar43 = -iVar36;
                    if (0 < iVar36) {
                      iVar43 = iVar36;
                    }
                    local_358.bigend.vect[1] = ~(iVar43 / iVar26);
                  }
                  else {
                    local_358.bigend.vect[1] = local_358.bigend.vect[1] / iVar26;
                  }
                }
                if (iVar25 != 1) {
                  if (iVar25 == 4) {
                    if (local_358.bigend.vect[2] < 0) {
                      local_358.bigend.vect[2] = local_358.bigend.vect[2] + 1;
                      uVar39 = -local_358.bigend.vect[2];
                      if (0 < local_358.bigend.vect[2]) {
                        uVar39 = local_358.bigend.vect[2];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056f97e:
                      local_358.bigend.vect[2] = ~uVar39;
                    }
                    else {
                      local_358.bigend.vect[2] = (uint)local_358.bigend.vect[2] >> 2;
                    }
                  }
                  else if (iVar25 == 2) {
                    if (local_358.bigend.vect[2] < 0) {
                      local_358.bigend.vect[2] = local_358.bigend.vect[2] + 1;
                      uVar39 = -local_358.bigend.vect[2];
                      if (0 < local_358.bigend.vect[2]) {
                        uVar39 = local_358.bigend.vect[2];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056f97e;
                    }
                    local_358.bigend.vect[2] = (uint)local_358.bigend.vect[2] >> 1;
                  }
                  else if (local_358.bigend.vect[2] < 0) {
                    iVar36 = local_358.bigend.vect[2] + 1;
                    iVar43 = -iVar36;
                    if (0 < iVar36) {
                      iVar43 = iVar36;
                    }
                    local_358.bigend.vect[2] = ~(iVar43 / iVar25);
                  }
                  else {
                    local_358.bigend.vect[2] = local_358.bigend.vect[2] / iVar25;
                  }
                }
              }
              else {
                local_1b8._0_8_ = (FabFactory<amrex::FArrayBox> *)0x0;
                local_1b8._8_4_ = 0;
                lVar28 = 0;
                do {
                  if (((local_358.btype.itype >> ((uint)lVar28 & 0x1f) & 1) != 0) &&
                     (local_358.bigend.vect[lVar28] % local_318.vect[lVar28] != 0)) {
                    *(undefined4 *)(local_1b8 + lVar28 * 4) = 1;
                  }
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 3);
                if (iVar35 != 1) {
                  if (iVar35 == 4) {
                    if (local_358.bigend.vect[0] < 0) {
                      local_358.bigend.vect[0] = local_358.bigend.vect[0] + 1;
                      uVar39 = -local_358.bigend.vect[0];
                      if (0 < local_358.bigend.vect[0]) {
                        uVar39 = local_358.bigend.vect[0];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056f32a:
                      local_358.bigend.vect[0] = ~uVar39;
                    }
                    else {
                      local_358.bigend.vect[0] = (uint)local_358.bigend.vect[0] >> 2;
                    }
                  }
                  else if (iVar35 == 2) {
                    if (local_358.bigend.vect[0] < 0) {
                      local_358.bigend.vect[0] = local_358.bigend.vect[0] + 1;
                      uVar39 = -local_358.bigend.vect[0];
                      if (0 < local_358.bigend.vect[0]) {
                        uVar39 = local_358.bigend.vect[0];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056f32a;
                    }
                    local_358.bigend.vect[0] = (uint)local_358.bigend.vect[0] >> 1;
                  }
                  else if (local_358.bigend.vect[0] < 0) {
                    iVar36 = local_358.bigend.vect[0] + 1;
                    iVar43 = -iVar36;
                    if (0 < iVar36) {
                      iVar43 = iVar36;
                    }
                    local_358.bigend.vect[0] = ~(iVar43 / iVar35);
                  }
                  else {
                    local_358.bigend.vect[0] = local_358.bigend.vect[0] / iVar35;
                  }
                }
                if (iVar26 != 1) {
                  if (iVar26 == 4) {
                    if (local_358.bigend.vect[1] < 0) {
                      local_358.bigend.vect[1] = local_358.bigend.vect[1] + 1;
                      uVar39 = -local_358.bigend.vect[1];
                      if (0 < local_358.bigend.vect[1]) {
                        uVar39 = local_358.bigend.vect[1];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056f391:
                      local_358.bigend.vect[1] = ~uVar39;
                    }
                    else {
                      local_358.bigend.vect[1] = (uint)local_358.bigend.vect[1] >> 2;
                    }
                  }
                  else if (iVar26 == 2) {
                    if (local_358.bigend.vect[1] < 0) {
                      local_358.bigend.vect[1] = local_358.bigend.vect[1] + 1;
                      uVar39 = -local_358.bigend.vect[1];
                      if (0 < local_358.bigend.vect[1]) {
                        uVar39 = local_358.bigend.vect[1];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056f391;
                    }
                    local_358.bigend.vect[1] = (uint)local_358.bigend.vect[1] >> 1;
                  }
                  else if (local_358.bigend.vect[1] < 0) {
                    iVar36 = local_358.bigend.vect[1] + 1;
                    iVar43 = -iVar36;
                    if (0 < iVar36) {
                      iVar43 = iVar36;
                    }
                    local_358.bigend.vect[1] = ~(iVar43 / iVar26);
                  }
                  else {
                    local_358.bigend.vect[1] = local_358.bigend.vect[1] / iVar26;
                  }
                }
                if (iVar25 != 1) {
                  if (iVar25 == 4) {
                    if (local_358.bigend.vect[2] < 0) {
                      local_358.bigend.vect[2] = local_358.bigend.vect[2] + 1;
                      uVar39 = -local_358.bigend.vect[2];
                      if (0 < local_358.bigend.vect[2]) {
                        uVar39 = local_358.bigend.vect[2];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056f3f4:
                      local_358.bigend.vect[2] = ~uVar39;
                    }
                    else {
                      local_358.bigend.vect[2] = (uint)local_358.bigend.vect[2] >> 2;
                    }
                  }
                  else if (iVar25 == 2) {
                    if (local_358.bigend.vect[2] < 0) {
                      local_358.bigend.vect[2] = local_358.bigend.vect[2] + 1;
                      uVar39 = -local_358.bigend.vect[2];
                      if (0 < local_358.bigend.vect[2]) {
                        uVar39 = local_358.bigend.vect[2];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056f3f4;
                    }
                    local_358.bigend.vect[2] = (uint)local_358.bigend.vect[2] >> 1;
                  }
                  else if (local_358.bigend.vect[2] < 0) {
                    iVar36 = local_358.bigend.vect[2] + 1;
                    iVar43 = -iVar36;
                    if (0 < iVar36) {
                      iVar43 = iVar36;
                    }
                    local_358.bigend.vect[2] = ~(iVar43 / iVar25);
                  }
                  else {
                    local_358.bigend.vect[2] = local_358.bigend.vect[2] / iVar25;
                  }
                }
                local_358.bigend.vect[0] = local_358.bigend.vect[0] + local_1b8._0_4_;
                local_358.bigend.vect[1] = local_358.bigend.vect[1] + local_1b8._4_4_;
                local_358.bigend.vect[2] = local_358.bigend.vect[2] + local_1b8._8_4_;
              }
            }
            if (local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<amrex::Box,std::allocator<amrex::Box>>::
              _M_realloc_insert<amrex::Box_const&>
                        ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_2b8,
                         (iterator)
                         local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_358);
            }
            else {
              *(ulong *)((local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->bigend).vect =
                   CONCAT44(local_358.bigend.vect[1],local_358.bigend.vect[0]);
              *(undefined8 *)
               (((local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish)->bigend).vect + 2) = local_358._20_8_;
              *(undefined8 *)
               ((local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect = local_358.smallend.vect._0_8_;
              *(ulong *)(((local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->smallend).vect + 2) =
                   CONCAT44(local_358.bigend.vect[0],local_358.smallend.vect[2]);
              local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (((byte)local_2e8 & iVar25 == 1U) == 0) {
              uVar39 = (uint)local_338._M_head_impl;
              if (iVar35 != 1) {
                if (iVar35 == 4) {
                  if ((int)(uint)local_338._M_head_impl < 0) {
                    uVar37 = (uint)local_338._M_head_impl + 1;
                    uVar39 = -uVar37;
                    if (0 < (int)uVar37) {
                      uVar39 = uVar37;
                    }
                    uVar39 = uVar39 >> 2;
LAB_0056f4cd:
                    uVar39 = ~uVar39;
                  }
                  else {
                    uVar39 = (uint)local_338._M_head_impl >> 2;
                  }
                }
                else if (iVar35 == 2) {
                  if ((int)(uint)local_338._M_head_impl < 0) {
                    uVar37 = (uint)local_338._M_head_impl + 1;
                    uVar39 = -uVar37;
                    if (0 < (int)uVar37) {
                      uVar39 = uVar37;
                    }
                    uVar39 = uVar39 >> 1;
                    goto LAB_0056f4cd;
                  }
                  uVar39 = (uint)local_338._M_head_impl >> 1;
                }
                else if ((int)(uint)local_338._M_head_impl < 0) {
                  iVar36 = (uint)local_338._M_head_impl + 1;
                  iVar43 = -iVar36;
                  if (0 < iVar36) {
                    iVar43 = iVar36;
                  }
                  uVar39 = ~(iVar43 / iVar35);
                }
                else {
                  uVar39 = (int)(uint)local_338._M_head_impl / iVar35;
                }
              }
              if (iVar26 != 1) {
                if (iVar26 == 4) {
                  if ((long)local_338._M_head_impl < 0) {
                    local_338._M_head_impl._4_4_ = local_338._M_head_impl._4_4_ + 1;
                    uVar37 = -local_338._M_head_impl._4_4_;
                    if (0 < (int)local_338._M_head_impl._4_4_) {
                      uVar37 = local_338._M_head_impl._4_4_;
                    }
                    uVar37 = uVar37 >> 2;
LAB_0056f532:
                    local_338._M_head_impl._4_4_ = ~uVar37;
                  }
                  else {
                    local_338._M_head_impl._4_4_ = local_338._M_head_impl._4_4_ >> 2;
                  }
                }
                else if (iVar26 == 2) {
                  if ((long)local_338._M_head_impl < 0) {
                    local_338._M_head_impl._4_4_ = local_338._M_head_impl._4_4_ + 1;
                    uVar37 = -local_338._M_head_impl._4_4_;
                    if (0 < (int)local_338._M_head_impl._4_4_) {
                      uVar37 = local_338._M_head_impl._4_4_;
                    }
                    uVar37 = uVar37 >> 1;
                    goto LAB_0056f532;
                  }
                  local_338._M_head_impl._4_4_ = local_338._M_head_impl._4_4_ >> 1;
                }
                else if ((long)local_338._M_head_impl < 0) {
                  iVar36 = local_338._M_head_impl._4_4_ + 1;
                  iVar43 = -iVar36;
                  if (0 < iVar36) {
                    iVar43 = iVar36;
                  }
                  local_338._M_head_impl._4_4_ = ~(iVar43 / iVar26);
                }
                else {
                  local_338._M_head_impl._4_4_ = (int)local_338._M_head_impl._4_4_ / iVar26;
                }
              }
              local_338._M_head_impl._0_4_ = uVar39;
              if (iVar25 != 1) {
                if (iVar25 == 4) {
                  if ((int)IStack_330.itype < 0) {
                    uVar37 = IStack_330.itype + 1;
                    uVar39 = -uVar37;
                    if (0 < (int)uVar37) {
                      uVar39 = uVar37;
                    }
                    uVar39 = uVar39 >> 2;
LAB_0056f593:
                    IStack_330.itype = ~uVar39;
                  }
                  else {
                    IStack_330.itype = IStack_330.itype >> 2;
                  }
                }
                else if (iVar25 == 2) {
                  if ((int)IStack_330.itype < 0) {
                    uVar37 = IStack_330.itype + 1;
                    uVar39 = -uVar37;
                    if (0 < (int)uVar37) {
                      uVar39 = uVar37;
                    }
                    uVar39 = uVar39 >> 1;
                    goto LAB_0056f593;
                  }
                  IStack_330.itype = IStack_330.itype >> 1;
                }
                else if ((int)IStack_330.itype < 0) {
                  iVar36 = IStack_330.itype + 1;
                  iVar43 = -iVar36;
                  if (0 < iVar36) {
                    iVar43 = iVar36;
                  }
                  IStack_330.itype = ~(iVar43 / iVar25);
                }
                else {
                  IStack_330.itype = IStack_330.itype / iVar25;
                }
              }
              if (IStack_320.itype == 0) {
                if (iVar35 != 1) {
                  if (iVar35 == 4) {
                    if ((int)auStack_32c[0] < 0) {
                      auStack_32c[0] = auStack_32c[0] + 1;
                      uVar39 = -auStack_32c[0];
                      if (0 < (int)auStack_32c[0]) {
                        uVar39 = auStack_32c[0];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056f9b5:
                      auStack_32c[0] = ~uVar39;
                    }
                    else {
                      auStack_32c[0] = auStack_32c[0] >> 2;
                    }
                  }
                  else if (iVar35 == 2) {
                    if ((int)auStack_32c[0] < 0) {
                      auStack_32c[0] = auStack_32c[0] + 1;
                      uVar39 = -auStack_32c[0];
                      if (0 < (int)auStack_32c[0]) {
                        uVar39 = auStack_32c[0];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056f9b5;
                    }
                    auStack_32c[0] = auStack_32c[0] >> 1;
                  }
                  else if ((int)auStack_32c[0] < 0) {
                    iVar36 = auStack_32c[0] + 1;
                    iVar43 = -iVar36;
                    if (0 < iVar36) {
                      iVar43 = iVar36;
                    }
                    auStack_32c[0] = ~(iVar43 / iVar35);
                  }
                  else {
                    auStack_32c[0] = (int)auStack_32c[0] / iVar35;
                  }
                }
                if (iVar26 != 1) {
                  if (iVar26 == 4) {
                    if ((int)auStack_32c[1] < 0) {
                      auStack_32c[1] = auStack_32c[1] + 1;
                      uVar39 = -auStack_32c[1];
                      if (0 < (int)auStack_32c[1]) {
                        uVar39 = auStack_32c[1];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056fa1a:
                      auStack_32c[1] = ~uVar39;
                    }
                    else {
                      auStack_32c[1] = auStack_32c[1] >> 2;
                    }
                  }
                  else if (iVar26 == 2) {
                    if ((int)auStack_32c[1] < 0) {
                      auStack_32c[1] = auStack_32c[1] + 1;
                      uVar39 = -auStack_32c[1];
                      if (0 < (int)auStack_32c[1]) {
                        uVar39 = auStack_32c[1];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056fa1a;
                    }
                    auStack_32c[1] = auStack_32c[1] >> 1;
                  }
                  else if ((int)auStack_32c[1] < 0) {
                    iVar43 = auStack_32c[1] + 1;
                    iVar35 = -iVar43;
                    if (0 < iVar43) {
                      iVar35 = iVar43;
                    }
                    auStack_32c[1] = ~(iVar35 / iVar26);
                  }
                  else {
                    auStack_32c[1] = (int)auStack_32c[1] / iVar26;
                  }
                }
                if (iVar25 != 1) {
                  if (iVar25 == 4) {
                    if ((int)auStack_32c[2] < 0) {
                      auStack_32c[2] = auStack_32c[2] + 1;
                      uVar39 = -auStack_32c[2];
                      if (0 < (int)auStack_32c[2]) {
                        uVar39 = auStack_32c[2];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056fa88:
                      auStack_32c[2] = ~uVar39;
                    }
                    else {
                      auStack_32c[2] = auStack_32c[2] >> 2;
                    }
                  }
                  else if (iVar25 == 2) {
                    if ((int)auStack_32c[2] < 0) {
                      auStack_32c[2] = auStack_32c[2] + 1;
                      uVar39 = -auStack_32c[2];
                      if (0 < (int)auStack_32c[2]) {
                        uVar39 = auStack_32c[2];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056fa88;
                    }
                    auStack_32c[2] = auStack_32c[2] >> 1;
                  }
                  else if ((int)auStack_32c[2] < 0) {
                    iVar26 = auStack_32c[2] + 1;
                    iVar35 = -iVar26;
                    if (0 < iVar26) {
                      iVar35 = iVar26;
                    }
                    auStack_32c[2] = ~(iVar35 / iVar25);
                  }
                  else {
                    auStack_32c[2] = (int)auStack_32c[2] / iVar25;
                  }
                }
              }
              else {
                local_1b8._0_8_ = (FabFactory<amrex::FArrayBox> *)0x0;
                local_1b8._8_4_ = 0;
                lVar28 = 0;
                do {
                  if (((IStack_320.itype >> ((uint)lVar28 & 0x1f) & 1) != 0) &&
                     ((int)auStack_32c[lVar28] % local_318.vect[lVar28] != 0)) {
                    *(undefined4 *)(local_1b8 + lVar28 * 4) = 1;
                  }
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 3);
                if (iVar35 != 1) {
                  if (iVar35 == 4) {
                    if ((int)auStack_32c[0] < 0) {
                      auStack_32c[0] = auStack_32c[0] + 1;
                      uVar39 = -auStack_32c[0];
                      if (0 < (int)auStack_32c[0]) {
                        uVar39 = auStack_32c[0];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056f691:
                      auStack_32c[0] = ~uVar39;
                    }
                    else {
                      auStack_32c[0] = auStack_32c[0] >> 2;
                    }
                  }
                  else if (iVar35 == 2) {
                    if ((int)auStack_32c[0] < 0) {
                      auStack_32c[0] = auStack_32c[0] + 1;
                      uVar39 = -auStack_32c[0];
                      if (0 < (int)auStack_32c[0]) {
                        uVar39 = auStack_32c[0];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056f691;
                    }
                    auStack_32c[0] = auStack_32c[0] >> 1;
                  }
                  else if ((int)auStack_32c[0] < 0) {
                    iVar36 = auStack_32c[0] + 1;
                    iVar43 = -iVar36;
                    if (0 < iVar36) {
                      iVar43 = iVar36;
                    }
                    auStack_32c[0] = ~(iVar43 / iVar35);
                  }
                  else {
                    auStack_32c[0] = (int)auStack_32c[0] / iVar35;
                  }
                }
                if (iVar26 != 1) {
                  if (iVar26 == 4) {
                    if ((int)auStack_32c[1] < 0) {
                      auStack_32c[1] = auStack_32c[1] + 1;
                      uVar39 = -auStack_32c[1];
                      if (0 < (int)auStack_32c[1]) {
                        uVar39 = auStack_32c[1];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056f6f8:
                      auStack_32c[1] = ~uVar39;
                    }
                    else {
                      auStack_32c[1] = auStack_32c[1] >> 2;
                    }
                  }
                  else if (iVar26 == 2) {
                    if ((int)auStack_32c[1] < 0) {
                      auStack_32c[1] = auStack_32c[1] + 1;
                      uVar39 = -auStack_32c[1];
                      if (0 < (int)auStack_32c[1]) {
                        uVar39 = auStack_32c[1];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056f6f8;
                    }
                    auStack_32c[1] = auStack_32c[1] >> 1;
                  }
                  else if ((int)auStack_32c[1] < 0) {
                    iVar43 = auStack_32c[1] + 1;
                    iVar35 = -iVar43;
                    if (0 < iVar43) {
                      iVar35 = iVar43;
                    }
                    auStack_32c[1] = ~(iVar35 / iVar26);
                  }
                  else {
                    auStack_32c[1] = (int)auStack_32c[1] / iVar26;
                  }
                }
                if (iVar25 != 1) {
                  if (iVar25 == 4) {
                    if ((int)auStack_32c[2] < 0) {
                      auStack_32c[2] = auStack_32c[2] + 1;
                      uVar39 = -auStack_32c[2];
                      if (0 < (int)auStack_32c[2]) {
                        uVar39 = auStack_32c[2];
                      }
                      uVar39 = uVar39 >> 2;
LAB_0056f759:
                      auStack_32c[2] = ~uVar39;
                    }
                    else {
                      auStack_32c[2] = auStack_32c[2] >> 2;
                    }
                  }
                  else if (iVar25 == 2) {
                    if ((int)auStack_32c[2] < 0) {
                      auStack_32c[2] = auStack_32c[2] + 1;
                      uVar39 = -auStack_32c[2];
                      if (0 < (int)auStack_32c[2]) {
                        uVar39 = auStack_32c[2];
                      }
                      uVar39 = uVar39 >> 1;
                      goto LAB_0056f759;
                    }
                    auStack_32c[2] = auStack_32c[2] >> 1;
                  }
                  else if ((int)auStack_32c[2] < 0) {
                    iVar26 = auStack_32c[2] + 1;
                    iVar35 = -iVar26;
                    if (0 < iVar26) {
                      iVar35 = iVar26;
                    }
                    auStack_32c[2] = ~(iVar35 / iVar25);
                  }
                  else {
                    auStack_32c[2] = (int)auStack_32c[2] / iVar25;
                  }
                }
                auStack_32c[0] = auStack_32c[0] + local_1b8._0_4_;
                auStack_32c[1] = auStack_32c[1] + local_1b8._4_4_;
                auStack_32c[2] = auStack_32c[2] + local_1b8._8_4_;
              }
            }
            if (local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<amrex::Box,std::allocator<amrex::Box>>::
              _M_realloc_insert<amrex::Box_const&>
                        ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_290,
                         (iterator)
                         local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Box *)&local_338);
            }
            else {
              *(ulong *)((local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->bigend).vect =
                   CONCAT44(auStack_32c[1],auStack_32c[0]);
              *(undefined8 *)
               (((local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish)->bigend).vect + 2) = stack0xfffffffffffffcdc;
              *(FabFactory<amrex::FArrayBox> **)
               ((local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect = local_338._M_head_impl;
              *(ulong *)(((local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->smallend).vect + 2) =
                   CONCAT44(auStack_32c[0],IStack_330.itype);
              local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            uVar39 = CONCAT31(0,((double)(int)((auStack_32c[2] - IStack_330.itype) + 1) *
                                (double)(int)((auStack_32c[1] -
                                              (int)((ulong)local_338._M_head_impl >> 0x20)) + 1) *
                                (double)(int)((auStack_32c[0] - (int)local_338._M_head_impl) + 1)) /
                                local_2e0 < local_2c8);
            local_1b8._0_4_ = uVar39;
            if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_1f8,
                         (iterator)
                         local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)local_1b8);
            }
            else {
              *local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar39;
              local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar34 = iVar34 + (int)local_300;
            bVar22 = true;
          }
        }
      } while ((bVar22) && (iVar42 = iVar42 + 1, iVar42 < (this->info).max_coarsening_level));
    }
    uVar39 = (int)((long)local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
    uVar47 = local_2e8 >> 0x20;
    local_2e8 = uVar47 << 0x20;
    bVar22 = false;
    if (1 < (int)uVar39) {
      bVar22 = false;
      uVar41 = 1;
      local_2e8 = uVar47 << 0x20;
      do {
        if ((bVar22) ||
           (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar41] != 0)) {
LAB_0056fbad:
          local_318.vect[2] =
               ((local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar41 - 1].bigend.vect[2] -
                local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start[uVar41 - 1].smallend.vect[2]) + 1) /
               ((local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar41].bigend.vect[2] -
                local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start[uVar41].smallend.vect[2]) + 1);
          local_318.vect._0_8_ =
               (long)((local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar41 - 1].bigend.vect[1] -
                      local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar41 - 1].smallend.vect[1]) + 1) /
               (long)((local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar41].bigend.vect[1] -
                      local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar41].smallend.vect[1]) + 1) << 0x20 |
               (long)((local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar41 - 1].bigend.vect[0] -
                      local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar41 - 1].smallend.vect[0]) + 1) /
               (long)((local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar41].bigend.vect[0] -
                      local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar41].smallend.vect[0]) + 1) & 0xffffffffU;
          bVar23 = BoxArray::coarsenable
                             ((((local_308->
                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ).
                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_finish + -1,&local_318,1);
          if (bVar23) {
            std::vector<amrex::BoxArray,std::allocator<amrex::BoxArray>>::emplace_back<amrex::Box&>
                      ((vector<amrex::BoxArray,std::allocator<amrex::BoxArray>> *)
                       (local_308->
                       super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       ).
                       super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start + uVar41);
            local_2a0.vect[1] = (this->info).agg_grid_size;
            local_2a0.vect[0] = local_2a0.vect[1];
            local_2a0.vect[2] = local_2a0.vect[1];
            if ((((this->info).do_semicoarsening == true) &&
                ((long)uVar41 <= (long)(this->info).max_semicoarsening_level)) &&
               (lVar28 = (long)(this->info).semicoarsening_direction, lVar28 != -1)) {
              local_1b8._0_8_ =
                   *(undefined8 *)
                    local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar41].smallend.vect;
              uVar32 = *(undefined8 *)
                        local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar41].bigend.vect;
              uVar18 = *(undefined8 *)
                        (local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar41].bigend.vect + 2);
              uVar21 = local_1b8._0_8_;
              local_1b8._8_4_ =
                   (undefined4)
                   *(undefined8 *)
                    (local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar41].smallend.vect + 2);
              iStack_1ac = (int)uVar32;
              aoStack_1a8._0_4_ = (undefined4)((ulong)uVar32 >> 0x20);
              aoStack_1a8._4_4_ = (undefined4)uVar18;
              auStack_1a0[0]._0_4_ = (undefined4)((ulong)uVar18 >> 0x20);
              lVar46 = 0;
              do {
                if (((uint)(undefined4)auStack_1a0[0] >> ((uint)lVar46 & 0x1f) & 1) != 0) {
                  (&iStack_1ac)[lVar46] = (&iStack_1ac)[lVar46] + -1;
                }
                lVar46 = lVar46 + 1;
              } while (lVar46 != 3);
              iVar42 = (iStack_1ac - local_1b8._0_4_) + 1;
              local_1b8._4_4_ = (undefined4)((ulong)local_1b8._0_8_ >> 0x20);
              iVar25 = (aoStack_1a8._0_4_ - local_1b8._4_4_) + 1;
              iVar35 = (aoStack_1a8._4_4_ - local_1b8._8_4_) + 1;
              iVar34 = local_2a0.vect[1] + -1;
              local_1b8._0_8_ = uVar21;
              local_2a0.vect[lVar28] =
                   ((iVar34 + iVar25) / iVar25) * ((iVar34 + iVar42) / iVar42) *
                   ((iVar34 + iVar35) / iVar35) * local_2a0.vect[lVar28];
            }
            BoxArray::maxSize((((local_308->
                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ).
                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_finish + -1,&local_2a0);
            pvVar10 = &((local_2d8->
                        super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                        ).
                        super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
            ;
            DistributionMapping::DistributionMapping((DistributionMapping *)local_1b8);
            std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
            emplace_back<amrex::DistributionMapping>(pvVar10,(DistributionMapping *)local_1b8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(iStack_1ac,local_1b8._8_4_)
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(iStack_1ac,local_1b8._8_4_));
            }
            uVar27 = (int)local_2e8;
            if (!bVar22) {
              uVar27 = (undefined4)uVar41;
            }
            local_2e8 = CONCAT44(local_2e8._4_4_,uVar27);
            if (!bVar22) {
              bVar22 = true;
            }
          }
          if (!bVar23) break;
        }
        else {
          bVar23 = BoxArray::coarsenable
                             ((local_2c0->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              local_228.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar41,&local_204);
          if (!bVar23) goto LAB_0056fbad;
          pvVar9 = &((local_308->
                     super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                     ).
                     super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
          amrex::coarsen((BoxArray *)local_1b8,
                         (local_2c0->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                         ).super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_228.
                         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
                         .super__Vector_impl_data._M_start + uVar41);
          std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::
          emplace_back<amrex::BoxArray>(pvVar9,(BoxArray *)local_1b8);
          BoxArray::~BoxArray((BoxArray *)local_1b8);
          std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
          push_back(&((local_2d8->
                      super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ).
                      super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ,(local_278->
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ).
                     super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        emplace_back<amrex::Box&,amrex::RealBox_const&,int_const&,std::array<int,3ul>const&>
                  ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
                   (local_270->
                   super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                   ).
                   super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar41,(RealBox *)local_268,&local_294,
                   &local_1e0);
        uVar41 = uVar41 + 1;
      } while (uVar41 != (uVar39 & 0x7fffffff));
    }
    if (local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_228.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_228.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pVVar40 = local_230;
    if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_290.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_2c8 = (double)((ulong)local_2c8 & 0xffffffff00000000);
    local_2e0 = 0.0;
  }
  pVVar14 = (local_308->
            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            ).
            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar34 = (int)((ulong)((long)(pVVar14->
                               super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        *(long *)&(pVVar14->
                                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                        ) >> 3) * -0x3b13b13b;
  *(local_2d0->super_vector<int,_std::allocator<int>_>).
   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = iVar34;
  if (1 < iVar34) {
    lVar28 = 0x188;
    lVar46 = 0;
    do {
      lVar44 = *(long *)&(((this->m_geom).
                           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      local_1b8._8_4_ =
           ((*(int *)(lVar44 + -200 + lVar28) - *(int *)(lVar44 + -0xd4 + lVar28)) + 1) /
           ((*(int *)(lVar44 + lVar28) - *(int *)(lVar44 + -0xc + lVar28)) + 1);
      local_1b8._0_8_ =
           (long)((*(int *)(lVar44 + -0xcc + lVar28) - *(int *)(lVar44 + -0xd8 + lVar28)) + 1) /
           (long)((*(int *)(lVar44 + -4 + lVar28) - *(int *)(lVar44 + -0x10 + lVar28)) + 1) << 0x20
           | (long)((*(int *)(lVar44 + -0xd0 + lVar28) - *(int *)(lVar44 + -0xdc + lVar28)) + 1) /
             (long)((*(int *)(lVar44 + -8 + lVar28) - *(int *)(lVar44 + -0x14 + lVar28)) + 1) &
             0xffffffffU;
      iVar15._M_current =
           (this->mg_coarsen_ratio_vec).
           super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          (this->mg_coarsen_ratio_vec).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
          .super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::
        _M_realloc_insert<amrex::IntVect>
                  (&(this->mg_coarsen_ratio_vec).
                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,iVar15,
                   (IntVect *)local_1b8);
      }
      else {
        (iVar15._M_current)->vect[2] = local_1b8._8_4_;
        *(undefined8 *)(iVar15._M_current)->vect = local_1b8._0_8_;
        ppIVar2 = &(this->mg_coarsen_ratio_vec).
                   super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppIVar2 = *ppIVar2 + 1;
      }
      lVar46 = lVar46 + 1;
      lVar28 = lVar28 + 200;
    } while (lVar46 < (long)*(local_2d0->super_vector<int,_std::allocator<int>_>).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + -1);
  }
  if (0 < this->m_num_amr_levels) {
    lVar28 = 0;
    do {
      if (((pVVar40->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           [lVar28] == 4) &&
         (iVar15._M_current =
               (this->mg_coarsen_ratio_vec).
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_finish,
         iVar15._M_current ==
         (this->mg_coarsen_ratio_vec).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
         super__Vector_impl_data._M_start)) {
        local_1b8._0_8_ = (FabFactory<amrex::FArrayBox> *)0x200000002;
        local_1b8._8_4_ = 2;
        if (iVar15._M_current ==
            (this->mg_coarsen_ratio_vec).
            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::
          _M_realloc_insert<amrex::IntVect>
                    (&(this->mg_coarsen_ratio_vec).
                      super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,iVar15,
                     (IntVect *)local_1b8);
        }
        else {
          (iVar15._M_current)->vect[2] = 2;
          (iVar15._M_current)->vect[0] = 2;
          (iVar15._M_current)->vect[1] = 2;
          ppIVar2 = &(this->mg_coarsen_ratio_vec).
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppIVar2 = *ppIVar2 + 1;
        }
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < this->m_num_amr_levels);
  }
  dVar48 = local_2e0;
  if (bVar22) {
    makeAgglomeratedDMap
              ((local_308->
               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (local_2d8->
               super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    dVar48 = local_2e0;
  }
  else if (((ulong)local_2e0 & 1) != 0) {
    makeConsolidatedDMap
              ((local_308->
               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (local_2d8->
               super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(anonymous_namespace)::consolidation_ratio,
               (anonymous_namespace)::consolidation_strategy);
  }
  this->m_bottom_comm = this->m_default_comm;
  this->m_do_agglomeration = bVar22;
  this->m_do_consolidation = (bool)(SUB81(dVar48,0) & 1);
  if ((anonymous_namespace)::flag_verbose_linop != 0) {
    if (bVar22) {
      poVar33 = OutStream();
      local_1b8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
      local_1b8._8_4_ = SUB84(poVar33,0);
      iStack_1ac = (int)((ulong)poVar33 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
      *(undefined8 *)
       ((long)auStack_1a0 + *(long *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18)) =
           *(undefined8 *)
            ((long)CONCAT44(iStack_1ac,local_1b8._8_4_) +
            *(long *)(*(long *)CONCAT44(iStack_1ac,local_1b8._8_4_) + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a8,
                 "MLLinOp::defineGrids(): agglomerated AMR level 0 starting at MG level ",0x46);
      std::ostream::operator<<(aoStack_1a8,(int)local_2e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8," of ",4);
      std::ostream::operator<<
                (aoStack_1a8,
                 *(local_2d0->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start);
      cVar17 = (char)aoStack_1a8;
      std::ios::widen((char)*(undefined8 *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18) +
                      cVar17);
      std::ostream::put(cVar17);
      std::ostream::flush();
    }
    else if (((ulong)dVar48 & 1) == 0) {
      poVar33 = OutStream();
      local_1b8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
      local_1b8._8_4_ = SUB84(poVar33,0);
      iStack_1ac = (int)((ulong)poVar33 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
      *(undefined8 *)
       ((long)auStack_1a0 + *(long *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18)) =
           *(undefined8 *)
            ((long)CONCAT44(iStack_1ac,local_1b8._8_4_) +
            *(long *)(*(long *)CONCAT44(iStack_1ac,local_1b8._8_4_) + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a8,
                 "MLLinOp::defineGrids(): no agglomeration or consolidation of AMR level 0",0x48);
      cVar17 = (char)aoStack_1a8;
      std::ios::widen((char)*(undefined8 *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18) +
                      cVar17);
      std::ostream::put(cVar17);
      std::ostream::flush();
    }
    else {
      poVar33 = OutStream();
      local_1b8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
      local_1b8._8_4_ = SUB84(poVar33,0);
      iStack_1ac = (int)((ulong)poVar33 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
      *(undefined8 *)
       ((long)auStack_1a0 + *(long *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18)) =
           *(undefined8 *)
            ((long)CONCAT44(iStack_1ac,local_1b8._8_4_) +
            *(long *)(*(long *)CONCAT44(iStack_1ac,local_1b8._8_4_) + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a8,
                 "MLLinOp::defineGrids(): consolidated AMR level 0 starting at MG level ",0x46);
      std::ostream::operator<<(aoStack_1a8,(int)local_2c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8," of ",4);
      std::ostream::operator<<
                (aoStack_1a8,
                 *(local_2d0->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8," (ratio = ",10);
      std::ostream::operator<<(aoStack_1a8,(anonymous_namespace)::consolidation_ratio);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,")",1);
      cVar17 = (char)aoStack_1a8;
      std::ios::widen((char)*(undefined8 *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18) +
                      cVar17);
      std::ostream::put(cVar17);
      std::ostream::flush();
    }
    Print::~Print((Print *)local_1b8);
  }
  if (0 < this->m_num_amr_levels) {
    uVar47 = 0;
    do {
      if (1 < (local_2d0->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar47]) {
        uVar41 = 1;
        do {
          pVVar16 = (this->m_factory).
                    super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          (*this->_vptr_MLLinOp[0x42])
                    ((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      *)local_1b8,this,uVar47 & 0xffffffff,uVar41);
          std::
          vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
          ::
          emplace_back<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>
                    ((vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
                      *)(pVVar16 + uVar47),
                     (unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      *)local_1b8);
          if ((_Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               )local_1b8._0_8_ != (FabFactory<amrex::FArrayBox> *)0x0) {
            (*(*(_func_int ***)local_1b8._0_8_)[1])();
          }
          uVar39 = (int)uVar41 + 1;
          uVar41 = (ulong)uVar39;
        } while ((int)uVar39 <
                 (local_2d0->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[uVar47]);
      }
      uVar47 = uVar47 + 1;
    } while ((long)uVar47 < (long)this->m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLLinOp::defineGrids (const Vector<Geometry>& a_geom,
                      const Vector<BoxArray>& a_grids,
                      const Vector<DistributionMapping>& a_dmap,
                      const Vector<FabFactory<FArrayBox> const*>& a_factory)
{
    BL_PROFILE("MLLinOp::defineGrids()");

    m_num_amr_levels = a_geom.size();

    m_amr_ref_ratio.resize(m_num_amr_levels);
    m_num_mg_levels.resize(m_num_amr_levels);

    m_geom.resize(m_num_amr_levels);
    m_grids.resize(m_num_amr_levels);
    m_dmap.resize(m_num_amr_levels);
    m_factory.resize(m_num_amr_levels);

    m_default_comm = ParallelContext::CommunicatorSub();

    const RealBox& rb = a_geom[0].ProbDomain();
    const int coord = a_geom[0].Coord();
    const Array<int,AMREX_SPACEDIM>& is_per = a_geom[0].isPeriodic();

    IntVect mg_coarsen_ratio_v(mg_coarsen_ratio);
    IntVect mg_box_min_width_v(mg_box_min_width);
    IntVect mg_domain_min_width_v(mg_domain_min_width);
    if (hasHiddenDimension()) {
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(AMREX_SPACEDIM == 3 && m_num_amr_levels == 1,
                                         "Hidden direction only supported for 3d level solve");
        mg_coarsen_ratio_v[info.hidden_direction] = 1;
        mg_box_min_width_v[info.hidden_direction] = 0;
        mg_domain_min_width_v[info.hidden_direction] = 0;
    }

    // fine amr levels
    for (int amrlev = m_num_amr_levels-1; amrlev > 0; --amrlev)
    {
        m_num_mg_levels[amrlev] = 1;
        m_geom[amrlev].push_back(a_geom[amrlev]);
        m_grids[amrlev].push_back(a_grids[amrlev]);
        m_dmap[amrlev].push_back(a_dmap[amrlev]);
        if (amrlev < a_factory.size()) {
            m_factory[amrlev].emplace_back(a_factory[amrlev]->clone());
        } else {
            m_factory[amrlev].push_back(std::make_unique<FArrayBoxFactory>());
        }

        IntVect rr = mg_coarsen_ratio_v;
        const Box& dom = a_geom[amrlev].Domain();
        for (int i = 0; i < 2; ++i)
        {
            if (!dom.coarsenable(rr)) amrex::Abort("MLLinOp: Uncoarsenable domain");

            const Box& cdom = amrex::coarsen(dom,rr);
            if (cdom == a_geom[amrlev-1].Domain()) break;

            ++(m_num_mg_levels[amrlev]);

            m_geom[amrlev].emplace_back(cdom, rb, coord, is_per);

            m_grids[amrlev].push_back(a_grids[amrlev]);
            AMREX_ASSERT(m_grids[amrlev].back().coarsenable(rr));
            m_grids[amrlev].back().coarsen(rr);

            m_dmap[amrlev].push_back(a_dmap[amrlev]);

            rr *= mg_coarsen_ratio_v;
        }

        if (hasHiddenDimension()) {
            m_amr_ref_ratio[amrlev-1] = rr[AMREX_SPACEDIM-info.hidden_direction];
        } else {
            m_amr_ref_ratio[amrlev-1] = rr[0];
        }
    }

    // coarsest amr level
    m_num_mg_levels[0] = 1;
    m_geom[0].push_back(a_geom[0]);
    m_grids[0].push_back(a_grids[0]);
    m_dmap[0].push_back(a_dmap[0]);
    if (a_factory.size() > 0) {
        m_factory[0].emplace_back(a_factory[0]->clone());
    } else {
        m_factory[0].push_back(std::make_unique<FArrayBoxFactory>());
    }

    m_domain_covered.resize(m_num_amr_levels, false);
    auto npts0 = m_grids[0][0].numPts();
    m_domain_covered[0] = (npts0 == compactify(m_geom[0][0].Domain()).numPts());
    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        if (!m_domain_covered[amrlev-1]) break;
        m_domain_covered[amrlev] = (m_grids[amrlev][0].numPts() ==
                                    compactify(m_geom[amrlev][0].Domain()).numPts());
    }

    Box aggbox;
    bool aggable = false;

    if (info.do_agglomeration)
    {
        if (m_domain_covered[0])
        {
            aggbox = m_geom[0][0].Domain();
            if (hasHiddenDimension()) {
                aggbox.makeSlab(hiddenDirection(), m_grids[0][0][0].smallEnd(hiddenDirection()));
            }
            aggable = true;
        }
        else
        {
            aggbox = m_grids[0][0].minimalBox();
            aggable = (aggbox.numPts() == npts0);
        }
    }

    bool agged = false;
    bool coned = false;
    int agg_lev = 0, con_lev = 0;

    AMREX_ALWAYS_ASSERT( ! (info.do_semicoarsening && info.hasHiddenDimension())
                         && info.semicoarsening_direction >= -1
                         && info.semicoarsening_direction < AMREX_SPACEDIM );

    if (info.do_agglomeration && aggable)
    {
        Box dbx = m_geom[0][0].Domain();
        Box bbx = aggbox;
        Real const nbxs = static_cast<Real>(m_grids[0][0].size());
        Real const threshold_npts = static_cast<Real>(AMREX_D_TERM(info.agg_grid_size,
                                                                  *info.agg_grid_size,
                                                                  *info.agg_grid_size));
        Vector<Box> domainboxes{dbx};
        Vector<Box> boundboxes{bbx};
        Vector<int> agg_flag{false};
        Vector<IntVect> accum_coarsen_ratio{IntVect(1)};
        int numsclevs = 0;

        for (int lev = 0; lev < info.max_coarsening_level; ++lev)
        {
            IntVect rr_level = mg_coarsen_ratio_v;
            bool const do_semicoarsening_level = info.do_semicoarsening
                && numsclevs < info.max_semicoarsening_level;
            if (do_semicoarsening_level
                && info.semicoarsening_direction != -1)
            {
                rr_level[info.semicoarsening_direction] = 1;
            }
            IntVect is_coarsenable;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                IntVect rr_dir(1);
                rr_dir[idim] = rr_level[idim];
                is_coarsenable[idim] = dbx.coarsenable(rr_dir, mg_domain_min_width_v)
                    && bbx.coarsenable(rr_dir, mg_box_min_width_v);
                if (!is_coarsenable[idim] && do_semicoarsening_level
                    && info.semicoarsening_direction == -1)
                {
                    is_coarsenable[idim] = true;
                    rr_level[idim] = 1;
                }
            }
            if (is_coarsenable != IntVect(1) || rr_level == IntVect(1)) {
                break;
            }
            if (do_semicoarsening_level && info.semicoarsening_direction == -1) {
                // make sure there is at most one direction that is not coarsened
                int n_ones = AMREX_D_TERM(  static_cast<int>(rr_level[0] == 1),
                                          + static_cast<int>(rr_level[1] == 1),
                                          + static_cast<int>(rr_level[2] == 1));
                if (n_ones > 1) { break; }
            }
            if (rr_level != mg_coarsen_ratio_v) {
                ++numsclevs;
            }

            accum_coarsen_ratio.push_back(accum_coarsen_ratio.back()*rr_level);
            domainboxes.push_back(dbx.coarsen(rr_level));
            boundboxes.push_back(bbx.coarsen(rr_level));
            bool to_agg = (bbx.d_numPts() / nbxs) < 0.999*threshold_npts;
            agg_flag.push_back(to_agg);
        }

        for (int lev = 1, nlevs = domainboxes.size(); lev < nlevs; ++lev) {
            if (!agged && !agg_flag[lev] &&
                a_grids[0].coarsenable(accum_coarsen_ratio[lev], mg_box_min_width_v))
            {
                m_grids[0].push_back(amrex::coarsen(a_grids[0], accum_coarsen_ratio[lev]));
                m_dmap[0].push_back(a_dmap[0]);
            } else {
                IntVect cr = domainboxes[lev-1].length() / domainboxes[lev].length();
                if (!m_grids[0].back().coarsenable(cr)) {
                    break; // average_down would fail if fine boxarray is not coarsenable.
                }
                m_grids[0].emplace_back(boundboxes[lev]);
                IntVect max_grid_size(info.agg_grid_size);
                if (info.do_semicoarsening && info.max_semicoarsening_level >= lev
                    && info.semicoarsening_direction != -1)
                {
                    IntVect blen = amrex::enclosedCells(boundboxes[lev]).size();
                    AMREX_D_TERM(int mgs_0 = (max_grid_size[0]+blen[0]-1) / blen[0];,
                                 int mgs_1 = (max_grid_size[1]+blen[1]-1) / blen[1];,
                                 int mgs_2 = (max_grid_size[2]+blen[2]-1) / blen[2]);
                    max_grid_size[info.semicoarsening_direction]
                        *= AMREX_D_TERM(mgs_0, *mgs_1, *mgs_2);
                }
                m_grids[0].back().maxSize(max_grid_size);
                m_dmap[0].push_back(DistributionMapping());
                if (!agged) {
                    agged = true;
                    agg_lev = lev;
                }
            }
            m_geom[0].emplace_back(domainboxes[lev],rb,coord,is_per);
        }
    }
    else
    {
        Real avg_npts = 0.0;
        if (info.do_consolidation) {
            avg_npts = static_cast<Real>(a_grids[0].d_numPts()) / static_cast<Real>(ParallelContext::NProcsSub());
            if (consolidation_threshold == -1) {
                consolidation_threshold = AMREX_D_TERM(info.con_grid_size,
                                                      *info.con_grid_size,
                                                      *info.con_grid_size);
            }
        }

        Box const& dom0 = a_geom[0].Domain();
        IntVect rr_vec(1);
        int numsclevs = 0;
        for (int lev = 0; lev < info.max_coarsening_level; ++lev)
        {
            IntVect rr_level = mg_coarsen_ratio_v;
            bool do_semicoarsening_level = info.do_semicoarsening
                && numsclevs < info.max_semicoarsening_level;
            if (do_semicoarsening_level
                && info.semicoarsening_direction != -1)
            {
                rr_level[info.semicoarsening_direction] = 1;
            }
            IntVect is_coarsenable;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                IntVect rr_dir(1);
                rr_dir[idim] = rr_vec[idim] * rr_level[idim];
                is_coarsenable[idim] = dom0.coarsenable(rr_dir, mg_domain_min_width_v)
                    && a_grids[0].coarsenable(rr_dir, mg_box_min_width_v);
                if (!is_coarsenable[idim] && do_semicoarsening_level
                    && info.semicoarsening_direction == -1)
                {
                    is_coarsenable[idim] = true;
                    rr_level[idim] = 1;
                }
            }
            if (is_coarsenable != IntVect(1) || rr_level == IntVect(1)) {
                break;
            }
            if (do_semicoarsening_level && info.semicoarsening_direction == -1) {
                // make sure there is at most one direction that is not coarsened
                int n_ones = AMREX_D_TERM(  static_cast<int>(rr_level[0] == 1),
                                          + static_cast<int>(rr_level[1] == 1),
                                          + static_cast<int>(rr_level[2] == 1));
                if (n_ones > 1) { break; }
            }
            if (rr_level != mg_coarsen_ratio_v) {
                ++numsclevs;
            }
            rr_vec *= rr_level;

            m_geom[0].emplace_back(amrex::coarsen(dom0, rr_vec), rb, coord, is_per);
            m_grids[0].push_back(amrex::coarsen(a_grids[0], rr_vec));

            if (info.do_consolidation)
            {
                if (avg_npts/(AMREX_D_TERM(rr_vec[0], *rr_vec[1], *rr_vec[2]))
                    < Real(0.999)*consolidation_threshold)
                {
                    coned = true;
                    con_lev = m_dmap[0].size();
                    m_dmap[0].push_back(DistributionMapping());
                }
                else
                {
                    m_dmap[0].push_back(m_dmap[0].back());
                }
            }
            else
            {
                m_dmap[0].push_back(a_dmap[0]);
            }
        }
    }

    m_num_mg_levels[0] = m_grids[0].size();

    for (int mglev = 0; mglev < m_num_mg_levels[0] - 1; mglev++){
        const Box& fine_domain = m_geom[0][mglev].Domain();
        const Box& crse_domain = m_geom[0][mglev+1].Domain();
        mg_coarsen_ratio_vec.push_back(fine_domain.length()/crse_domain.length());
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        if (AMRRefRatio(amrlev) == 4 && mg_coarsen_ratio_vec.size() == 0) {
            mg_coarsen_ratio_vec.push_back(IntVect(2));
        }
    }

    if (agged)
    {
        makeAgglomeratedDMap(m_grids[0], m_dmap[0]);
    }
    else if (coned)
    {
        makeConsolidatedDMap(m_grids[0], m_dmap[0], consolidation_ratio, consolidation_strategy);
    }

    if (flag_use_mota && (agged || coned))
    {
        remapNeighborhoods(m_dmap[0]);
    }

    if (agged || coned)
    {
        m_bottom_comm = makeSubCommunicator(m_dmap[0].back());
    }
    else
    {
        m_bottom_comm = m_default_comm;
    }

    m_do_agglomeration = agged;
    m_do_consolidation = coned;

    if (flag_verbose_linop) {
        if (agged) {
            Print() << "MLLinOp::defineGrids(): agglomerated AMR level 0 starting at MG level "
                    << agg_lev << " of " << m_num_mg_levels[0] << std::endl;
        } else if (coned) {
            Print() << "MLLinOp::defineGrids(): consolidated AMR level 0 starting at MG level "
                    << con_lev << " of " << m_num_mg_levels[0]
                    << " (ratio = " << consolidation_ratio << ")" << std::endl;
        } else {
            Print() << "MLLinOp::defineGrids(): no agglomeration or consolidation of AMR level 0" << std::endl;
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        for (int mglev = 1; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_factory[amrlev].emplace_back(makeFactory(amrlev,mglev));
        }
    }

    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        AMREX_ASSERT_WITH_MESSAGE(m_grids[amrlev][0].coarsenable(m_amr_ref_ratio[amrlev-1]),
                                  "MLLinOp: grids not coarsenable between AMR levels");
    }
}